

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  Primitive PVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  Geometry *pGVar29;
  __int_type_conflict _Var30;
  long lVar31;
  long lVar32;
  RTCFilterFunctionN p_Var33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  unkbyte9 Var79;
  undefined1 auVar80 [13];
  undefined1 auVar81 [12];
  undefined1 auVar82 [13];
  undefined1 auVar83 [12];
  undefined1 auVar84 [13];
  undefined1 auVar85 [12];
  undefined1 auVar86 [13];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined6 uVar89;
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vfloat_impl<4> vVar103;
  undefined4 uVar104;
  ulong uVar107;
  StackEntry *pSVar108;
  ulong uVar109;
  ulong extraout_RAX;
  uint uVar105;
  RTCRayN *pRVar111;
  undefined4 uVar106;
  ulong extraout_RAX_00;
  RTCIntersectArguments *pRVar112;
  RTCIntersectArguments *pRVar113;
  long lVar114;
  RTCIntersectArguments *pRVar115;
  RTCIntersectArguments *extraout_RDX;
  RTCIntersectArguments *extraout_RDX_00;
  RTCIntersectArguments *pRVar116;
  RTCIntersectArguments *pRVar117;
  RTCIntersectArguments *pRVar118;
  bool bVar119;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  short sVar128;
  int iVar129;
  undefined1 auVar130 [12];
  int iVar194;
  __m128 a_1;
  char cVar198;
  undefined1 auVar136 [16];
  undefined1 auVar132 [12];
  undefined1 auVar140 [16];
  undefined1 auVar133 [12];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar134 [12];
  undefined1 auVar153 [16];
  undefined1 auVar135 [12];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  uint uVar197;
  uint uVar199;
  uint uVar200;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar192;
  float pp;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar225;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  char cVar226;
  float fVar227;
  float fVar229;
  char cVar246;
  float fVar247;
  float fVar249;
  vfloat4 a;
  float fVar228;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar252;
  float fVar253;
  char cVar266;
  undefined1 uVar267;
  undefined1 uVar268;
  float fVar269;
  float fVar271;
  undefined1 auVar254 [16];
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar279 [12];
  float fVar301;
  float fVar303;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [16];
  float fVar302;
  float fVar304;
  float fVar305;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar290;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  char cVar319;
  float fVar306;
  float fVar307;
  float fVar320;
  float fVar322;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar321;
  float fVar323;
  float fVar324;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar325;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar337;
  float fVar338;
  undefined1 auVar339 [12];
  float fVar350;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar345 [16];
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar373;
  float fVar375;
  undefined1 auVar360 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  float fVar374;
  float fVar376;
  float fVar377;
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar370;
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  float fVar378;
  float fVar379;
  float fVar388;
  float fVar390;
  undefined1 auVar380 [16];
  undefined1 auVar383 [16];
  undefined1 auVar386 [16];
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar387 [16];
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar406;
  float fVar410;
  undefined1 auVar400 [16];
  undefined1 auVar403 [16];
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  float fVar417;
  float fVar425;
  float fVar427;
  undefined1 auVar418 [16];
  undefined1 auVar421 [16];
  float fVar426;
  float fVar428;
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  float fVar429;
  float fVar442;
  float fVar446;
  undefined1 auVar433 [16];
  undefined1 auVar436 [16];
  undefined1 auVar439 [16];
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar447;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  float fVar453;
  float fVar454;
  float fVar455;
  float fVar458;
  float fVar459;
  float fVar461;
  float fVar462;
  float fVar464;
  undefined1 auVar456 [16];
  float fVar460;
  float fVar463;
  float fVar465;
  undefined1 auVar457 [16];
  float fVar466;
  float fVar474;
  float fVar475;
  undefined1 auVar467 [16];
  float fVar476;
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 local_6c8 [8];
  float fStack_6c0;
  float fStack_6bc;
  undefined2 local_6a8;
  undefined2 uStack_6a6;
  undefined2 uStack_6a4;
  undefined2 uStack_6a2;
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined8 local_638;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5c8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  RTCIntersectArguments local_318;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  ulong uVar110;
  undefined1 auVar131 [12];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar137 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined2 uVar193;
  int iVar195;
  int iVar196;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar282 [16];
  undefined1 auVar296 [16];
  undefined1 auVar298 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar313 [16];
  undefined1 auVar330 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  
  PVar21 = prim[1];
  uVar107 = (ulong)(byte)PVar21;
  lVar114 = uVar107 * 0x25;
  uVar106 = *(undefined4 *)(prim + uVar107 * 4 + 6);
  uVar104 = *(undefined4 *)(prim + uVar107 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar107 * 6 + 6);
  uVar23 = *(undefined4 *)(prim + uVar107 * 0xf + 6);
  uVar24 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + 6);
  uVar25 = *(undefined4 *)(prim + uVar107 * 0x11 + 6);
  uVar26 = *(undefined4 *)(prim + uVar107 * 0x1a + 6);
  uVar27 = *(undefined4 *)(prim + uVar107 * 0x1b + 6);
  uVar28 = *(undefined4 *)(prim + uVar107 * 0x1c + 6);
  auVar309 = *(undefined1 (*) [16])(prim + lVar114 + 6);
  auVar231._12_4_ = auVar309._12_4_;
  auVar130._0_8_ = CONCAT44(auVar231._12_4_,auVar231._12_4_);
  auVar130._8_4_ = auVar231._12_4_;
  auVar231._0_12_ = auVar130;
  fVar276 = (*(float *)(ray + k * 4) - auVar309._0_4_) * auVar231._12_4_;
  fVar301 = (*(float *)(ray + k * 4 + 0x10) - auVar309._4_4_) * auVar231._12_4_;
  fVar303 = (*(float *)(ray + k * 4 + 0x20) - auVar309._8_4_) * auVar231._12_4_;
  fVar453 = *(float *)(ray + k * 4 + 0x40) * auVar231._12_4_;
  fVar458 = *(float *)(ray + k * 4 + 0x50) * auVar231._12_4_;
  fVar461 = *(float *)(ray + k * 4 + 0x60) * auVar231._12_4_;
  auVar37[0xd] = 0;
  auVar37._0_13_ = auVar231._0_13_;
  auVar37[0xe] = auVar309[0xf];
  auVar41[0xc] = auVar309[0xe];
  auVar41._0_12_ = auVar130;
  auVar41._13_2_ = auVar37._13_2_;
  auVar45[0xb] = 0;
  auVar45._0_11_ = auVar130._0_11_;
  auVar45._12_3_ = auVar41._12_3_;
  auVar49[10] = auVar309[0xd];
  auVar49._0_10_ = auVar130._0_10_;
  auVar49._11_4_ = auVar45._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar130._0_9_;
  auVar53._10_5_ = auVar49._10_5_;
  auVar57[8] = auVar309[0xc];
  auVar57._0_8_ = auVar130._0_8_;
  auVar57._9_6_ = auVar53._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar104 >> 0x18)),auVar309[0xf]);
  auVar61._6_9_ = Var79;
  auVar61[5] = (char)((uint)uVar104 >> 0x10);
  auVar61[4] = auVar309[0xe];
  auVar61._0_4_ = auVar231._12_4_;
  cVar246 = (char)((uint)uVar104 >> 8);
  auVar80._2_11_ = auVar61._4_11_;
  auVar80[1] = cVar246;
  auVar80[0] = auVar309[0xd];
  cVar226 = (char)uVar104;
  sVar128 = CONCAT11(cVar226,auVar309[0xc]);
  auVar65._2_13_ = auVar80;
  auVar65._0_2_ = sVar128;
  uVar193 = (undefined2)Var79;
  auVar423._0_12_ = auVar65._0_12_;
  auVar423._12_2_ = uVar193;
  auVar423._14_2_ = uVar193;
  auVar365._12_4_ = auVar423._12_4_;
  auVar365._0_10_ = auVar65._0_10_;
  auVar365._10_2_ = auVar61._4_2_;
  auVar309._10_6_ = auVar365._10_6_;
  auVar309._0_8_ = auVar65._0_8_;
  auVar309._8_2_ = auVar61._4_2_;
  auVar81._4_8_ = auVar309._8_8_;
  auVar81._2_2_ = auVar80._0_2_;
  auVar81._0_2_ = auVar80._0_2_;
  iVar129 = (int)sVar128 >> 8;
  iVar194 = auVar81._0_4_ >> 0x18;
  auVar131._0_8_ = CONCAT44(iVar194,iVar129);
  auVar131._8_4_ = auVar309._8_4_ >> 0x18;
  auVar440._12_4_ = auVar365._12_4_ >> 0x18;
  auVar440._0_12_ = auVar131;
  fVar333 = (float)iVar194;
  cVar198 = cVar246 >> 7;
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar440._0_13_;
  auVar38[0xe] = cVar198;
  auVar42[0xc] = cVar198;
  auVar42._0_12_ = auVar131;
  auVar42._13_2_ = auVar38._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = auVar131._0_11_;
  auVar46._12_3_ = auVar42._12_3_;
  auVar50[10] = cVar198;
  auVar50._0_10_ = auVar131._0_10_;
  auVar50._11_4_ = auVar46._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar131._0_9_;
  auVar54._10_5_ = auVar50._10_5_;
  auVar58[8] = cVar246;
  auVar58._0_8_ = auVar131._0_8_;
  auVar58._9_6_ = auVar54._9_6_;
  uVar268 = (undefined1)((uint)uVar22 >> 0x18);
  Var79 = CONCAT81(CONCAT71(auVar58._8_7_,uVar268),(short)cVar226 >> 7);
  uVar267 = (undefined1)((uint)uVar22 >> 0x10);
  auVar62._6_9_ = Var79;
  auVar62[5] = uVar267;
  auVar62[4] = (undefined1)((short)cVar226 >> 7);
  auVar62._0_4_ = iVar129;
  cVar266 = (char)((uint)uVar22 >> 8);
  auVar82._2_11_ = auVar62._4_11_;
  auVar82[1] = cVar266;
  auVar82[0] = (undefined1)((short)cVar226 >> 7);
  cVar246 = (char)uVar22;
  auVar66._2_13_ = auVar82;
  auVar66._0_2_ = CONCAT11(cVar246,cVar226);
  uVar193 = (undefined2)Var79;
  auVar138._0_12_ = auVar66._0_12_;
  auVar138._12_2_ = uVar193;
  auVar138._14_2_ = uVar193;
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._0_10_ = auVar66._0_10_;
  auVar137._10_2_ = auVar62._4_2_;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._0_8_ = auVar66._0_8_;
  auVar136._8_2_ = auVar62._4_2_;
  auVar83._4_8_ = auVar136._8_8_;
  auVar83._2_2_ = auVar82._0_2_;
  auVar83._0_2_ = auVar82._0_2_;
  iVar194 = (int)CONCAT11(cVar246,cVar226) >> 8;
  iVar195 = auVar83._0_4_ >> 0x18;
  auVar132._0_8_ = CONCAT44(iVar195,iVar194);
  auVar132._8_4_ = auVar136._8_4_ >> 0x18;
  auVar139._12_4_ = auVar137._12_4_ >> 0x18;
  auVar139._0_12_ = auVar132;
  fVar425 = (float)iVar195;
  cVar198 = cVar266 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar139._0_13_;
  auVar39[0xe] = cVar198;
  auVar43[0xc] = cVar198;
  auVar43._0_12_ = auVar132;
  auVar43._13_2_ = auVar39._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar132._0_11_;
  auVar47._12_3_ = auVar43._12_3_;
  auVar51[10] = cVar198;
  auVar51._0_10_ = auVar132._0_10_;
  auVar51._11_4_ = auVar47._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar132._0_9_;
  auVar55._10_5_ = auVar51._10_5_;
  auVar59[8] = cVar266;
  auVar59._0_8_ = auVar132._0_8_;
  auVar59._9_6_ = auVar55._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar246 >> 7);
  auVar63._6_9_ = Var79;
  auVar63[5] = (char)((uint)uVar24 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar246 >> 7);
  auVar63._0_4_ = iVar194;
  cVar319 = (char)((uint)uVar24 >> 8);
  auVar84._2_11_ = auVar63._4_11_;
  auVar84[1] = cVar319;
  auVar84[0] = (undefined1)((short)cVar246 >> 7);
  cVar226 = (char)uVar24;
  auVar67._2_13_ = auVar84;
  auVar67._0_2_ = CONCAT11(cVar226,cVar246);
  uVar193 = (undefined2)Var79;
  auVar142._0_12_ = auVar67._0_12_;
  auVar142._12_2_ = uVar193;
  auVar142._14_2_ = uVar193;
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._0_10_ = auVar67._0_10_;
  auVar141._10_2_ = auVar63._4_2_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._0_8_ = auVar67._0_8_;
  auVar140._8_2_ = auVar63._4_2_;
  auVar85._4_8_ = auVar140._8_8_;
  auVar85._2_2_ = auVar84._0_2_;
  auVar85._0_2_ = auVar84._0_2_;
  iVar195 = (int)CONCAT11(cVar226,cVar246) >> 8;
  iVar196 = auVar85._0_4_ >> 0x18;
  auVar133._0_8_ = CONCAT44(iVar196,iVar195);
  auVar133._8_4_ = auVar140._8_4_ >> 0x18;
  auVar143._12_4_ = auVar141._12_4_ >> 0x18;
  auVar143._0_12_ = auVar133;
  fVar350 = (float)iVar196;
  cVar198 = cVar319 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar143._0_13_;
  auVar40[0xe] = cVar198;
  auVar44[0xc] = cVar198;
  auVar44._0_12_ = auVar133;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar133._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = cVar198;
  auVar52._0_10_ = auVar133._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar133._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = cVar319;
  auVar60._0_8_ = auVar133._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var79 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar25 >> 0x18)),(short)cVar226 >> 7);
  auVar64._6_9_ = Var79;
  auVar64[5] = (char)((uint)uVar25 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar226 >> 7);
  auVar64._0_4_ = iVar195;
  auVar86._2_11_ = auVar64._4_11_;
  auVar86[1] = (char)((uint)uVar25 >> 8);
  auVar86[0] = (undefined1)((short)cVar226 >> 7);
  sVar128 = CONCAT11((char)uVar25,cVar226);
  auVar68._2_13_ = auVar86;
  auVar68._0_2_ = sVar128;
  uVar193 = (undefined2)Var79;
  auVar146._0_12_ = auVar68._0_12_;
  auVar146._12_2_ = uVar193;
  auVar146._14_2_ = uVar193;
  auVar145._12_4_ = auVar146._12_4_;
  auVar145._0_10_ = auVar68._0_10_;
  auVar145._10_2_ = auVar64._4_2_;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144._0_8_ = auVar68._0_8_;
  auVar144._8_2_ = auVar64._4_2_;
  auVar87._4_8_ = auVar144._8_8_;
  auVar87._2_2_ = auVar86._0_2_;
  auVar87._0_2_ = auVar86._0_2_;
  fVar396 = (float)((int)sVar128 >> 8);
  fVar406 = (float)(auVar87._0_4_ >> 0x18);
  fVar410 = (float)(auVar144._8_4_ >> 0x18);
  fVar227 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar114 + 0x16)) *
            *(float *)(prim + lVar114 + 0x1a);
  local_6a8._0_1_ = (undefined1)uVar106;
  local_6a8._1_1_ = (undefined1)((uint)uVar106 >> 8);
  uStack_6a6._0_1_ = (undefined1)((uint)uVar106 >> 0x10);
  uStack_6a6._1_1_ = (undefined1)((uint)uVar106 >> 0x18);
  uVar193 = CONCAT11(uStack_6a6._1_1_,uVar268);
  uVar10 = CONCAT35(CONCAT21(uVar193,(undefined1)uStack_6a6),CONCAT14(uVar267,uVar22));
  uVar89 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),local_6a8._1_1_),cVar266);
  uVar109 = CONCAT62(uVar89,CONCAT11((undefined1)local_6a8,cVar246));
  auVar256._8_4_ = 0;
  auVar256._0_8_ = uVar109;
  auVar256._12_2_ = uVar193;
  auVar256._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar255._12_4_ = auVar256._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar109;
  auVar255._10_2_ = uVar193;
  auVar254._10_6_ = auVar255._10_6_;
  auVar254._8_2_ = uVar193;
  auVar254._0_8_ = uVar109;
  uVar193 = (undefined2)uVar89;
  auVar88._4_8_ = auVar254._8_8_;
  auVar88._2_2_ = uVar193;
  auVar88._0_2_ = uVar193;
  fVar252 = (float)((int)CONCAT11((undefined1)local_6a8,cVar246) >> 8);
  fVar269 = (float)(auVar88._0_4_ >> 0x18);
  fVar271 = (float)(auVar254._8_4_ >> 0x18);
  uVar267 = (undefined1)((uint)uVar23 >> 0x18);
  uVar193 = CONCAT11(uVar267,uVar267);
  uVar267 = (undefined1)((uint)uVar23 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar193,uVar267),CONCAT14(uVar267,uVar23));
  uVar267 = (undefined1)((uint)uVar23 >> 8);
  uVar89 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar267),uVar267);
  sVar128 = CONCAT11((char)uVar23,(char)uVar23);
  uVar109 = CONCAT62(uVar89,sVar128);
  auVar469._8_4_ = 0;
  auVar469._0_8_ = uVar109;
  auVar469._12_2_ = uVar193;
  auVar469._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar468._12_4_ = auVar469._12_4_;
  auVar468._8_2_ = 0;
  auVar468._0_8_ = uVar109;
  auVar468._10_2_ = uVar193;
  auVar467._10_6_ = auVar468._10_6_;
  auVar467._8_2_ = uVar193;
  auVar467._0_8_ = uVar109;
  uVar193 = (undefined2)uVar89;
  auVar90._4_8_ = auVar467._8_8_;
  auVar90._2_2_ = uVar193;
  auVar90._0_2_ = uVar193;
  fVar228 = (float)((int)sVar128 >> 8);
  fVar247 = (float)(auVar90._0_4_ >> 0x18);
  fVar249 = (float)(auVar467._8_4_ >> 0x18);
  uVar267 = (undefined1)((uint)uVar26 >> 0x18);
  uVar193 = CONCAT11(uVar267,uVar267);
  uVar267 = (undefined1)((uint)uVar26 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar193,uVar267),CONCAT14(uVar267,uVar26));
  uVar267 = (undefined1)((uint)uVar26 >> 8);
  uVar89 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar267),uVar267);
  sVar128 = CONCAT11((char)uVar26,(char)uVar26);
  uVar109 = CONCAT62(uVar89,sVar128);
  auVar362._8_4_ = 0;
  auVar362._0_8_ = uVar109;
  auVar362._12_2_ = uVar193;
  auVar362._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar361._12_4_ = auVar362._12_4_;
  auVar361._8_2_ = 0;
  auVar361._0_8_ = uVar109;
  auVar361._10_2_ = uVar193;
  auVar360._10_6_ = auVar361._10_6_;
  auVar360._8_2_ = uVar193;
  auVar360._0_8_ = uVar109;
  uVar193 = (undefined2)uVar89;
  auVar91._4_8_ = auVar360._8_8_;
  auVar91._2_2_ = uVar193;
  auVar91._0_2_ = uVar193;
  fVar357 = (float)((int)sVar128 >> 8);
  fVar373 = (float)(auVar91._0_4_ >> 0x18);
  fVar375 = (float)(auVar360._8_4_ >> 0x18);
  uVar267 = (undefined1)((uint)uVar27 >> 0x18);
  uVar193 = CONCAT11(uVar267,uVar267);
  uVar267 = (undefined1)((uint)uVar27 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar193,uVar267),CONCAT14(uVar267,uVar27));
  uVar267 = (undefined1)((uint)uVar27 >> 8);
  uVar89 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar267),uVar267);
  sVar128 = CONCAT11((char)uVar27,(char)uVar27);
  uVar109 = CONCAT62(uVar89,sVar128);
  auVar382._8_4_ = 0;
  auVar382._0_8_ = uVar109;
  auVar382._12_2_ = uVar193;
  auVar382._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar381._12_4_ = auVar382._12_4_;
  auVar381._8_2_ = 0;
  auVar381._0_8_ = uVar109;
  auVar381._10_2_ = uVar193;
  auVar380._10_6_ = auVar381._10_6_;
  auVar380._8_2_ = uVar193;
  auVar380._0_8_ = uVar109;
  uVar193 = (undefined2)uVar89;
  auVar92._4_8_ = auVar380._8_8_;
  auVar92._2_2_ = uVar193;
  auVar92._0_2_ = uVar193;
  fVar378 = (float)((int)sVar128 >> 8);
  fVar388 = (float)(auVar92._0_4_ >> 0x18);
  fVar390 = (float)(auVar380._8_4_ >> 0x18);
  uVar267 = (undefined1)((uint)uVar28 >> 0x18);
  uVar193 = CONCAT11(uVar267,uVar267);
  uVar267 = (undefined1)((uint)uVar28 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar193,uVar267),CONCAT14(uVar267,uVar28));
  uVar267 = (undefined1)((uint)uVar28 >> 8);
  uVar89 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar267),uVar267);
  sVar128 = CONCAT11((char)uVar28,(char)uVar28);
  uVar109 = CONCAT62(uVar89,sVar128);
  auVar435._8_4_ = 0;
  auVar435._0_8_ = uVar109;
  auVar435._12_2_ = uVar193;
  auVar435._14_2_ = uVar193;
  uVar193 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar434._12_4_ = auVar435._12_4_;
  auVar434._8_2_ = 0;
  auVar434._0_8_ = uVar109;
  auVar434._10_2_ = uVar193;
  auVar433._10_6_ = auVar434._10_6_;
  auVar433._8_2_ = uVar193;
  auVar433._0_8_ = uVar109;
  uVar193 = (undefined2)uVar89;
  auVar93._4_8_ = auVar433._8_8_;
  auVar93._2_2_ = uVar193;
  auVar93._0_2_ = uVar193;
  fVar429 = (float)((int)sVar128 >> 8);
  fVar442 = (float)(auVar93._0_4_ >> 0x18);
  fVar446 = (float)(auVar433._8_4_ >> 0x18);
  fVar466 = fVar453 * fVar252 + fVar458 * (float)iVar129 + fVar461 * (float)iVar194;
  fVar474 = fVar453 * fVar269 + fVar458 * fVar333 + fVar461 * fVar425;
  fVar475 = fVar453 * fVar271 + fVar458 * (float)auVar131._8_4_ + fVar461 * (float)auVar132._8_4_;
  fVar476 = fVar453 * (float)(auVar255._12_4_ >> 0x18) +
            fVar458 * (float)auVar440._12_4_ + fVar461 * (float)auVar139._12_4_;
  fVar454 = fVar453 * fVar228 + fVar458 * (float)iVar195 + fVar461 * fVar396;
  fVar459 = fVar453 * fVar247 + fVar458 * fVar350 + fVar461 * fVar406;
  fVar462 = fVar453 * fVar249 + fVar458 * (float)auVar133._8_4_ + fVar461 * fVar410;
  fVar464 = fVar453 * (float)(auVar468._12_4_ >> 0x18) +
            fVar458 * (float)auVar143._12_4_ + fVar461 * (float)(auVar145._12_4_ >> 0x18);
  fVar306 = fVar453 * fVar357 + fVar458 * fVar378 + fVar461 * fVar429;
  fVar320 = fVar453 * fVar373 + fVar458 * fVar388 + fVar461 * fVar442;
  fVar322 = fVar453 * fVar375 + fVar458 * fVar390 + fVar461 * fVar446;
  fVar453 = fVar453 * (float)(auVar361._12_4_ >> 0x18) +
            fVar458 * (float)(auVar381._12_4_ >> 0x18) + fVar461 * (float)(auVar434._12_4_ >> 0x18);
  uVar10 = *(undefined8 *)(prim + uVar107 * 7 + 6);
  uVar11 = *(undefined8 *)(prim + uVar107 * 0xb + 6);
  uVar12 = *(undefined8 *)(prim + uVar107 * 9 + 6);
  uVar13 = *(undefined8 *)(prim + uVar107 * 0xd + 6);
  fVar458 = fVar252 * fVar276 + (float)iVar129 * fVar301 + (float)iVar194 * fVar303;
  fVar461 = fVar269 * fVar276 + fVar333 * fVar301 + fVar425 * fVar303;
  fVar272 = fVar271 * fVar276 + (float)auVar131._8_4_ * fVar301 + (float)auVar132._8_4_ * fVar303;
  fVar274 = (float)(auVar255._12_4_ >> 0x18) * fVar276 +
            (float)auVar440._12_4_ * fVar301 + (float)auVar139._12_4_ * fVar303;
  fVar396 = fVar228 * fVar276 + (float)iVar195 * fVar301 + fVar396 * fVar303;
  fVar406 = fVar247 * fVar276 + fVar350 * fVar301 + fVar406 * fVar303;
  fVar410 = fVar249 * fVar276 + (float)auVar133._8_4_ * fVar301 + fVar410 * fVar303;
  fVar425 = (float)(auVar468._12_4_ >> 0x18) * fVar276 +
            (float)auVar143._12_4_ * fVar301 + (float)(auVar145._12_4_ >> 0x18) * fVar303;
  fVar378 = fVar276 * fVar357 + fVar301 * fVar378 + fVar303 * fVar429;
  fVar388 = fVar276 * fVar373 + fVar301 * fVar388 + fVar303 * fVar442;
  fVar375 = fVar276 * fVar375 + fVar301 * fVar390 + fVar303 * fVar446;
  fVar390 = fVar276 * (float)(auVar361._12_4_ >> 0x18) +
            fVar301 * (float)(auVar381._12_4_ >> 0x18) + fVar303 * (float)(auVar434._12_4_ >> 0x18);
  uVar120 = -(uint)(1e-18 <= ABS(fVar466));
  uVar122 = -(uint)(1e-18 <= ABS(fVar474));
  uVar124 = -(uint)(1e-18 <= ABS(fVar475));
  uVar126 = -(uint)(1e-18 <= ABS(fVar476));
  auVar470._0_4_ = (uint)fVar466 & uVar120;
  auVar470._4_4_ = (uint)fVar474 & uVar122;
  auVar470._8_4_ = (uint)fVar475 & uVar124;
  auVar470._12_4_ = (uint)fVar476 & uVar126;
  auVar147._0_8_ = CONCAT44(~uVar122,~uVar120) & 0x219392ef219392ef;
  auVar147._8_4_ = ~uVar124 & 0x219392ef;
  auVar147._12_4_ = ~uVar126 & 0x219392ef;
  auVar147 = auVar147 | auVar470;
  uVar120 = -(uint)(1e-18 <= ABS(fVar454));
  uVar122 = -(uint)(1e-18 <= ABS(fVar459));
  uVar124 = -(uint)(1e-18 <= ABS(fVar462));
  uVar126 = -(uint)(1e-18 <= ABS(fVar464));
  auVar456._0_4_ = (uint)fVar454 & uVar120;
  auVar456._4_4_ = (uint)fVar459 & uVar122;
  auVar456._8_4_ = (uint)fVar462 & uVar124;
  auVar456._12_4_ = (uint)fVar464 & uVar126;
  auVar280._0_8_ = CONCAT44(~uVar122,~uVar120) & 0x219392ef219392ef;
  auVar280._8_4_ = ~uVar124 & 0x219392ef;
  auVar280._12_4_ = ~uVar126 & 0x219392ef;
  auVar280 = auVar280 | auVar456;
  uVar120 = -(uint)(1e-18 <= ABS(fVar306));
  uVar122 = -(uint)(1e-18 <= ABS(fVar320));
  uVar124 = -(uint)(1e-18 <= ABS(fVar322));
  uVar126 = -(uint)(1e-18 <= ABS(fVar453));
  auVar308._0_4_ = (uint)fVar306 & uVar120;
  auVar308._4_4_ = (uint)fVar320 & uVar122;
  auVar308._8_4_ = (uint)fVar322 & uVar124;
  auVar308._12_4_ = (uint)fVar453 & uVar126;
  auVar340._0_8_ = CONCAT44(~uVar122,~uVar120) & 0x219392ef219392ef;
  auVar340._8_4_ = ~uVar124 & 0x219392ef;
  auVar340._12_4_ = ~uVar126 & 0x219392ef;
  auVar340 = auVar340 | auVar308;
  auVar309 = rcpps(auVar308,auVar147);
  fVar429 = auVar309._0_4_;
  auVar148._0_4_ = auVar147._0_4_ * fVar429;
  fVar446 = auVar309._4_4_;
  auVar148._4_4_ = auVar147._4_4_ * fVar446;
  fVar454 = auVar309._8_4_;
  auVar148._8_4_ = auVar147._8_4_ * fVar454;
  fVar459 = auVar309._12_4_;
  auVar148._12_4_ = auVar147._12_4_ * fVar459;
  fVar429 = (1.0 - auVar148._0_4_) * fVar429 + fVar429;
  fVar446 = (1.0 - auVar148._4_4_) * fVar446 + fVar446;
  fVar454 = (1.0 - auVar148._8_4_) * fVar454 + fVar454;
  fVar459 = (1.0 - auVar148._12_4_) * fVar459 + fVar459;
  auVar309 = rcpps(auVar148,auVar280);
  fVar228 = auVar309._0_4_;
  auVar281._0_4_ = auVar280._0_4_ * fVar228;
  fVar247 = auVar309._4_4_;
  fVar269 = auVar280._4_4_ * fVar247;
  auVar279._0_8_ = CONCAT44(fVar269,auVar281._0_4_);
  fVar306 = auVar309._8_4_;
  auVar279._8_4_ = auVar280._8_4_ * fVar306;
  fVar357 = auVar309._12_4_;
  fVar228 = (1.0 - auVar281._0_4_) * fVar228 + fVar228;
  fVar247 = (1.0 - fVar269) * fVar247 + fVar247;
  fVar306 = (1.0 - auVar279._8_4_) * fVar306 + fVar306;
  fVar357 = (1.0 - auVar280._12_4_ * fVar357) * fVar357 + fVar357;
  auVar309 = rcpps(auVar309,auVar340);
  auVar149._0_4_ = auVar309._0_4_;
  auVar341._0_4_ = auVar340._0_4_ * auVar149._0_4_;
  fVar249 = auVar309._4_4_;
  fVar271 = auVar340._4_4_ * fVar249;
  auVar339._0_8_ = CONCAT44(fVar271,auVar341._0_4_);
  fVar320 = auVar309._8_4_;
  auVar339._8_4_ = auVar340._8_4_ * fVar320;
  fVar373 = auVar309._12_4_;
  uVar14 = *(undefined8 *)(prim + uVar107 * 0x12 + 6);
  fVar442 = (1.0 - auVar341._0_4_) * auVar149._0_4_ + auVar149._0_4_;
  fVar249 = (1.0 - fVar271) * fVar249 + fVar249;
  fVar320 = (1.0 - auVar339._8_4_) * fVar320 + fVar320;
  fVar373 = (1.0 - auVar340._12_4_ * fVar373) * fVar373 + fVar373;
  local_6a8 = (short)uVar10;
  uStack_6a6 = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_6a4 = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_6a2 = (undefined2)((ulong)uVar10 >> 0x30);
  auVar152._0_12_ = auVar309._0_12_;
  auVar152._12_2_ = auVar309._6_2_;
  auVar152._14_2_ = uStack_6a2;
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._0_10_ = auVar309._0_10_;
  auVar151._10_2_ = uStack_6a4;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._0_8_ = auVar309._0_8_;
  auVar150._8_2_ = auVar309._4_2_;
  auVar149._8_8_ = auVar150._8_8_;
  auVar149._6_2_ = uStack_6a6;
  auVar149._4_2_ = auVar309._2_2_;
  auVar153._0_4_ = (float)(int)local_6a8;
  fVar252 = (float)(auVar149._4_4_ >> 0x10);
  auVar134._0_8_ = CONCAT44(fVar252,auVar153._0_4_);
  auVar134._8_4_ = (float)(auVar150._8_4_ >> 0x10);
  auVar284._12_2_ = (short)((uint)fVar269 >> 0x10);
  auVar284._0_12_ = auVar279;
  auVar284._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._0_10_ = auVar279._0_10_;
  auVar283._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = SUB42(fVar269,0);
  auVar282._0_8_ = auVar279._0_8_;
  auVar281._8_8_ = auVar282._8_8_;
  auVar281._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar281._4_2_ = (short)((uint)auVar281._0_4_ >> 0x10);
  auVar156._12_2_ = (short)((uint)fVar252 >> 0x10);
  auVar156._0_12_ = auVar134;
  auVar156._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar134._0_10_;
  auVar155._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._8_2_ = SUB42(fVar252,0);
  auVar154._0_8_ = auVar134._0_8_;
  auVar153._8_8_ = auVar154._8_8_;
  auVar153._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar153._4_2_ = (short)((uint)auVar153._0_4_ >> 0x10);
  auVar157._0_4_ = (float)(int)(short)uVar12;
  fVar269 = (float)(auVar153._4_4_ >> 0x10);
  auVar135._0_8_ = CONCAT44(fVar269,auVar157._0_4_);
  auVar135._8_4_ = (float)(auVar154._8_4_ >> 0x10);
  auVar344._12_2_ = (short)((uint)fVar271 >> 0x10);
  auVar344._0_12_ = auVar339;
  auVar344._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar343._12_4_ = auVar344._12_4_;
  auVar343._0_10_ = auVar339._0_10_;
  auVar343._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar342._10_6_ = auVar343._10_6_;
  auVar342._8_2_ = SUB42(fVar271,0);
  auVar342._0_8_ = auVar339._0_8_;
  auVar341._8_8_ = auVar342._8_8_;
  auVar341._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar341._4_2_ = (short)((uint)auVar341._0_4_ >> 0x10);
  auVar160._12_2_ = (short)((uint)fVar269 >> 0x10);
  auVar160._0_12_ = auVar135;
  auVar160._14_2_ = (short)((ulong)uVar14 >> 0x30);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._0_10_ = auVar135._0_10_;
  auVar159._10_2_ = (short)((ulong)uVar14 >> 0x20);
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = SUB42(fVar269,0);
  auVar158._0_8_ = auVar135._0_8_;
  auVar157._8_8_ = auVar158._8_8_;
  auVar157._6_2_ = (short)((ulong)uVar14 >> 0x10);
  auVar157._4_2_ = (short)((uint)auVar157._0_4_ >> 0x10);
  fVar271 = (float)(auVar157._4_4_ >> 0x10);
  fVar322 = (float)(auVar158._8_4_ >> 0x10);
  uVar109 = *(ulong *)(prim + uVar107 * 0x16 + 6);
  uVar193 = (undefined2)(uVar109 >> 0x30);
  auVar385._8_4_ = 0;
  auVar385._0_8_ = uVar109;
  auVar385._12_2_ = uVar193;
  auVar385._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar109 >> 0x20);
  auVar384._12_4_ = auVar385._12_4_;
  auVar384._8_2_ = 0;
  auVar384._0_8_ = uVar109;
  auVar384._10_2_ = uVar193;
  auVar383._10_6_ = auVar384._10_6_;
  auVar383._8_2_ = uVar193;
  auVar383._0_8_ = uVar109;
  uVar193 = (undefined2)(uVar109 >> 0x10);
  auVar94._4_8_ = auVar383._8_8_;
  auVar94._2_2_ = uVar193;
  auVar94._0_2_ = uVar193;
  uVar110 = *(ulong *)(prim + uVar107 * 0x14 + 6);
  uVar193 = (undefined2)(uVar110 >> 0x30);
  auVar163._8_4_ = 0;
  auVar163._0_8_ = uVar110;
  auVar163._12_2_ = uVar193;
  auVar163._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar110 >> 0x20);
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._8_2_ = 0;
  auVar162._0_8_ = uVar110;
  auVar162._10_2_ = uVar193;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = uVar193;
  auVar161._0_8_ = uVar110;
  uVar193 = (undefined2)(uVar110 >> 0x10);
  auVar95._4_8_ = auVar161._8_8_;
  auVar95._2_2_ = uVar193;
  auVar95._0_2_ = uVar193;
  fVar276 = (float)(auVar95._0_4_ >> 0x10);
  fVar453 = (float)(auVar161._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar107 * 0x18 + 6);
  uVar193 = (undefined2)(uVar15 >> 0x30);
  auVar402._8_4_ = 0;
  auVar402._0_8_ = uVar15;
  auVar402._12_2_ = uVar193;
  auVar402._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar15 >> 0x20);
  auVar401._12_4_ = auVar402._12_4_;
  auVar401._8_2_ = 0;
  auVar401._0_8_ = uVar15;
  auVar401._10_2_ = uVar193;
  auVar400._10_6_ = auVar401._10_6_;
  auVar400._8_2_ = uVar193;
  auVar400._0_8_ = uVar15;
  uVar193 = (undefined2)(uVar15 >> 0x10);
  auVar96._4_8_ = auVar400._8_8_;
  auVar96._2_2_ = uVar193;
  auVar96._0_2_ = uVar193;
  uVar16 = *(ulong *)(prim + uVar107 * 0x1d + 6);
  uVar193 = (undefined2)(uVar16 >> 0x30);
  auVar166._8_4_ = 0;
  auVar166._0_8_ = uVar16;
  auVar166._12_2_ = uVar193;
  auVar166._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar16 >> 0x20);
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._8_2_ = 0;
  auVar165._0_8_ = uVar16;
  auVar165._10_2_ = uVar193;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._8_2_ = uVar193;
  auVar164._0_8_ = uVar16;
  uVar193 = (undefined2)(uVar16 >> 0x10);
  auVar97._4_8_ = auVar164._8_8_;
  auVar97._2_2_ = uVar193;
  auVar97._0_2_ = uVar193;
  fVar301 = (float)(auVar97._0_4_ >> 0x10);
  fVar333 = (float)(auVar164._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar107 * 0x21 + 6);
  uVar193 = (undefined2)(uVar17 >> 0x30);
  auVar420._8_4_ = 0;
  auVar420._0_8_ = uVar17;
  auVar420._12_2_ = uVar193;
  auVar420._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar17 >> 0x20);
  auVar419._12_4_ = auVar420._12_4_;
  auVar419._8_2_ = 0;
  auVar419._0_8_ = uVar17;
  auVar419._10_2_ = uVar193;
  auVar418._10_6_ = auVar419._10_6_;
  auVar418._8_2_ = uVar193;
  auVar418._0_8_ = uVar17;
  uVar193 = (undefined2)(uVar17 >> 0x10);
  auVar98._4_8_ = auVar418._8_8_;
  auVar98._2_2_ = uVar193;
  auVar98._0_2_ = uVar193;
  uVar18 = *(ulong *)(prim + uVar107 * 0x1f + 6);
  uVar193 = (undefined2)(uVar18 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar18;
  auVar169._12_2_ = uVar193;
  auVar169._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar18 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar18;
  auVar168._10_2_ = uVar193;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar193;
  auVar167._0_8_ = uVar18;
  uVar193 = (undefined2)(uVar18 >> 0x10);
  auVar99._4_8_ = auVar167._8_8_;
  auVar99._2_2_ = uVar193;
  auVar99._0_2_ = uVar193;
  fVar303 = (float)(auVar99._0_4_ >> 0x10);
  fVar350 = (float)(auVar167._8_4_ >> 0x10);
  uVar19 = *(ulong *)(prim + uVar107 * 0x23 + 6);
  uVar193 = (undefined2)(uVar19 >> 0x30);
  auVar438._8_4_ = 0;
  auVar438._0_8_ = uVar19;
  auVar438._12_2_ = uVar193;
  auVar438._14_2_ = uVar193;
  uVar193 = (undefined2)(uVar19 >> 0x20);
  auVar437._12_4_ = auVar438._12_4_;
  auVar437._8_2_ = 0;
  auVar437._0_8_ = uVar19;
  auVar437._10_2_ = uVar193;
  auVar436._10_6_ = auVar437._10_6_;
  auVar436._8_2_ = uVar193;
  auVar436._0_8_ = uVar19;
  uVar193 = (undefined2)(uVar19 >> 0x10);
  auVar100._4_8_ = auVar436._8_8_;
  auVar100._2_2_ = uVar193;
  auVar100._0_2_ = uVar193;
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar285._0_8_ =
       CONCAT44(((((float)(auVar281._4_4_ >> 0x10) - fVar252) * fVar227 + fVar252) - fVar461) *
                fVar446,((((float)(int)(short)uVar11 - auVar153._0_4_) * fVar227 + auVar153._0_4_) -
                        fVar458) * fVar429);
  auVar285._8_4_ =
       ((((float)(auVar282._8_4_ >> 0x10) - auVar134._8_4_) * fVar227 + auVar134._8_4_) - fVar272) *
       fVar454;
  auVar285._12_4_ =
       ((((float)(auVar283._12_4_ >> 0x10) - (float)(auVar151._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar151._12_4_ >> 0x10)) - fVar274) * fVar459;
  auVar345._0_4_ =
       ((((float)(int)(short)uVar13 - auVar157._0_4_) * fVar227 + auVar157._0_4_) - fVar458) *
       fVar429;
  auVar345._4_4_ =
       ((((float)(auVar341._4_4_ >> 0x10) - fVar269) * fVar227 + fVar269) - fVar461) * fVar446;
  auVar345._8_4_ =
       ((((float)(auVar342._8_4_ >> 0x10) - auVar135._8_4_) * fVar227 + auVar135._8_4_) - fVar272) *
       fVar454;
  auVar345._12_4_ =
       ((((float)(auVar343._12_4_ >> 0x10) - (float)(auVar155._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar155._12_4_ >> 0x10)) - fVar274) * fVar459;
  auVar386._0_8_ =
       CONCAT44(((((float)(auVar94._0_4_ >> 0x10) - fVar271) * fVar227 + fVar271) - fVar406) *
                fVar247,((((float)(int)(short)uVar109 - (float)(int)(short)uVar14) * fVar227 +
                         (float)(int)(short)uVar14) - fVar396) * fVar228);
  auVar386._8_4_ =
       ((((float)(auVar383._8_4_ >> 0x10) - fVar322) * fVar227 + fVar322) - fVar410) * fVar306;
  auVar386._12_4_ =
       ((((float)(auVar384._12_4_ >> 0x10) - (float)(auVar159._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar159._12_4_ >> 0x10)) - fVar425) * fVar357;
  auVar403._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar110) * fVar227 +
        (float)(int)(short)uVar110) - fVar396) * fVar228;
  auVar403._4_4_ =
       ((((float)(auVar96._0_4_ >> 0x10) - fVar276) * fVar227 + fVar276) - fVar406) * fVar247;
  auVar403._8_4_ =
       ((((float)(auVar400._8_4_ >> 0x10) - fVar453) * fVar227 + fVar453) - fVar410) * fVar306;
  auVar403._12_4_ =
       ((((float)(auVar401._12_4_ >> 0x10) - (float)(auVar162._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar162._12_4_ >> 0x10)) - fVar425) * fVar357;
  auVar421._0_8_ =
       CONCAT44(((((float)(auVar98._0_4_ >> 0x10) - fVar301) * fVar227 + fVar301) - fVar388) *
                fVar249,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar227 +
                         (float)(int)(short)uVar16) - fVar378) * fVar442);
  auVar421._8_4_ =
       ((((float)(auVar418._8_4_ >> 0x10) - fVar333) * fVar227 + fVar333) - fVar375) * fVar320;
  auVar421._12_4_ =
       ((((float)(auVar419._12_4_ >> 0x10) - (float)(auVar165._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar165._12_4_ >> 0x10)) - fVar390) * fVar373;
  auVar439._0_4_ =
       ((((float)(int)(short)uVar19 - (float)(int)(short)uVar18) * fVar227 +
        (float)(int)(short)uVar18) - fVar378) * fVar442;
  auVar439._4_4_ =
       ((((float)(auVar100._0_4_ >> 0x10) - fVar303) * fVar227 + fVar303) - fVar388) * fVar249;
  auVar439._8_4_ =
       ((((float)(auVar436._8_4_ >> 0x10) - fVar350) * fVar227 + fVar350) - fVar375) * fVar320;
  auVar439._12_4_ =
       ((((float)(auVar437._12_4_ >> 0x10) - (float)(auVar168._12_4_ >> 0x10)) * fVar227 +
        (float)(auVar168._12_4_ >> 0x10)) - fVar390) * fVar373;
  auVar230._8_4_ = auVar285._8_4_;
  auVar230._0_8_ = auVar285._0_8_;
  auVar230._12_4_ = auVar285._12_4_;
  auVar231 = minps(auVar230,auVar345);
  auVar201._8_4_ = auVar386._8_4_;
  auVar201._0_8_ = auVar386._0_8_;
  auVar201._12_4_ = auVar386._12_4_;
  auVar309 = minps(auVar201,auVar403);
  auVar231 = maxps(auVar231,auVar309);
  auVar202._8_4_ = auVar421._8_4_;
  auVar202._0_8_ = auVar421._0_8_;
  auVar202._12_4_ = auVar421._12_4_;
  auVar309 = minps(auVar202,auVar439);
  auVar170._4_4_ = uVar106;
  auVar170._0_4_ = uVar106;
  auVar170._8_4_ = uVar106;
  auVar170._12_4_ = uVar106;
  auVar309 = maxps(auVar309,auVar170);
  auVar309 = maxps(auVar231,auVar309);
  fVar228 = auVar309._0_4_ * 0.99999964;
  fVar247 = auVar309._4_4_ * 0.99999964;
  fVar249 = auVar309._8_4_ * 0.99999964;
  fVar252 = auVar309._12_4_ * 0.99999964;
  auVar309 = maxps(auVar285,auVar345);
  auVar231 = maxps(auVar386,auVar403);
  auVar309 = minps(auVar309,auVar231);
  auVar231 = maxps(auVar421,auVar439);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar171._4_4_ = uVar106;
  auVar171._0_4_ = uVar106;
  auVar171._8_4_ = uVar106;
  auVar171._12_4_ = uVar106;
  auVar231 = minps(auVar231,auVar171);
  auVar309 = minps(auVar309,auVar231);
  auVar203._0_4_ = -(uint)(PVar21 != (Primitive)0x0 && fVar228 <= auVar309._0_4_ * 1.0000004);
  auVar203._4_4_ = -(uint)(1 < (byte)PVar21 && fVar247 <= auVar309._4_4_ * 1.0000004);
  auVar203._8_4_ = -(uint)(2 < (byte)PVar21 && fVar249 <= auVar309._8_4_ * 1.0000004);
  auVar203._12_4_ = -(uint)(3 < (byte)PVar21 && fVar252 <= auVar309._12_4_ * 1.0000004);
  uVar120 = movmskps((int)(uVar107 * 0x16),auVar203);
  auVar204._0_12_ = mm_lookupmask_ps._240_12_;
  auVar204._12_4_ = 0;
LAB_0035aa86:
  if (uVar120 == 0) {
    return;
  }
  lVar114 = 0;
  if (uVar120 != 0) {
    for (; (uVar120 >> lVar114 & 1) == 0; lVar114 = lVar114 + 1) {
    }
  }
  uVar122 = *(uint *)(prim + 2);
  pRVar116 = (RTCIntersectArguments *)(ulong)uVar122;
  uVar124 = *(uint *)(prim + lVar114 * 4 + 6);
  pGVar29 = (context->scene->geometries).items[(long)pRVar116].ptr;
  uVar109 = (ulong)*(uint *)(*(long *)&pGVar29->field_0x58 +
                            (ulong)uVar124 *
                            pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar269 = pGVar29->fnumTimeSegments;
  fVar271 = (pGVar29->time_range).lower;
  fVar276 = ((*(float *)(ray + k * 4 + 0x70) - fVar271) / ((pGVar29->time_range).upper - fVar271)) *
            fVar269;
  fVar271 = floorf(fVar276);
  fVar269 = fVar269 + -1.0;
  if (fVar269 <= fVar271) {
    fVar271 = fVar269;
  }
  fVar269 = 0.0;
  if (0.0 <= fVar271) {
    fVar269 = fVar271;
  }
  _Var30 = pGVar29[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pRVar115 = (RTCIntersectArguments *)((long)(int)fVar269 * 0x38);
  lVar114 = *(long *)((long)&pRVar115->filter + _Var30);
  lVar31 = *(long *)((long)&pRVar115[1].intersect + _Var30);
  lVar32 = *(long *)((long)&pRVar115[2].context + _Var30);
  pfVar1 = (float *)(lVar31 + uVar109 * lVar32);
  pfVar2 = (float *)(lVar31 + (uVar109 + 1) * lVar32);
  pfVar3 = (float *)(lVar31 + (uVar109 + 2) * lVar32);
  fVar276 = fVar276 - fVar269;
  fVar333 = 1.0 - fVar276;
  pfVar4 = (float *)(lVar31 + lVar32 * (uVar109 + 3));
  pRVar112 = *(RTCIntersectArguments **)((long)&pRVar115->flags + _Var30);
  pSVar108 = (StackEntry *)(lVar114 * (uVar109 + 3));
  ppSVar5 = (Scene **)((long)&pRVar112->flags + lVar114 * uVar109);
  ppSVar6 = (Scene **)((long)&pRVar112->flags + lVar114 * (uVar109 + 1));
  ppSVar7 = (Scene **)((long)&pRVar112->flags + lVar114 * (uVar109 + 2));
  fVar396 = *(float *)ppSVar5 * fVar333 + *pfVar1 * fVar276;
  fVar406 = *(float *)((long)ppSVar5 + 4) * fVar333 + pfVar1[1] * fVar276;
  fVar410 = *(float *)(ppSVar5 + 1) * fVar333 + pfVar1[2] * fVar276;
  fVar458 = *(float *)ppSVar6 * fVar333 + *pfVar2 * fVar276;
  fVar461 = *(float *)((long)ppSVar6 + 4) * fVar333 + pfVar2[1] * fVar276;
  fVar272 = *(float *)(ppSVar6 + 1) * fVar333 + pfVar2[2] * fVar276;
  fVar388 = *(float *)ppSVar7 * fVar333 + *pfVar3 * fVar276;
  fVar375 = *(float *)((long)ppSVar7 + 4) * fVar333 + pfVar3[1] * fVar276;
  fVar390 = *(float *)(ppSVar7 + 1) * fVar333 + pfVar3[2] * fVar276;
  pfVar8 = (float *)((long)&(pSVar108->valid).field_0 + (long)&pRVar112->flags);
  local_608._0_4_ = fVar333 * *pfVar8 + fVar276 * *pfVar4;
  local_608._4_4_ = fVar333 * pfVar8[1] + fVar276 * pfVar4[1];
  fStack_600 = fVar333 * pfVar8[2] + fVar276 * pfVar4[2];
  fVar269 = *(float *)(ray + k * 4 + 0x40);
  fVar271 = *(float *)(ray + k * 4 + 0x50);
  fVar303 = *(float *)(ray + k * 4 + 0x60);
  fVar301 = fVar271 * fVar271;
  fVar306 = fVar303 * fVar303;
  fVar322 = fVar301 + fVar269 * fVar269 + fVar306;
  auVar172._0_8_ = CONCAT44(fVar301 + fVar301 + 0.0,fVar322);
  auVar172._8_4_ = fVar301 + fVar306 + fVar306;
  auVar172._12_4_ = fVar301 + 0.0 + 0.0;
  auVar310._8_4_ = auVar172._8_4_;
  auVar310._0_8_ = auVar172._0_8_;
  auVar310._12_4_ = auVar172._12_4_;
  auVar309 = rcpss(auVar310,auVar172);
  fVar378 = (2.0 - auVar309._0_4_ * fVar322) * auVar309._0_4_ *
            (((fVar410 + fVar272 + fVar390 + fStack_600) * 0.25 - *(float *)(ray + k * 4 + 0x20)) *
             fVar303 +
            ((fVar406 + fVar461 + fVar375 + (float)local_608._4_4_) * 0.25 -
            *(float *)(ray + k * 4 + 0x10)) * fVar271 +
            ((fVar396 + fVar458 + fVar388 + (float)local_608._0_4_) * 0.25 - *(float *)(ray + k * 4)
            ) * fVar269);
  fVar301 = fVar269 * fVar378 + *(float *)(ray + k * 4);
  fVar320 = fVar271 * fVar378 + *(float *)(ray + k * 4 + 0x10);
  fVar453 = fVar303 * fVar378 + *(float *)(ray + k * 4 + 0x20);
  fVar396 = fVar396 - fVar301;
  fVar406 = fVar406 - fVar320;
  fVar410 = fVar410 - fVar453;
  fVar425 = (*(float *)((long)ppSVar5 + 0xc) * fVar333 + pfVar1[3] * fVar276) - 0.0;
  fVar388 = fVar388 - fVar301;
  fVar375 = fVar375 - fVar320;
  fVar390 = fVar390 - fVar453;
  fVar227 = (*(float *)((long)ppSVar7 + 0xc) * fVar333 + pfVar3[3] * fVar276) - 0.0;
  fVar458 = fVar458 - fVar301;
  fVar461 = fVar461 - fVar320;
  fVar272 = fVar272 - fVar453;
  fVar274 = (*(float *)((long)ppSVar6 + 0xc) * fVar333 + pfVar2[3] * fVar276) - 0.0;
  local_608._0_4_ = (float)local_608._0_4_ - fVar301;
  local_608._4_4_ = (float)local_608._4_4_ - fVar320;
  fStack_600 = fStack_600 - fVar453;
  fStack_5fc = (fVar333 * pfVar8[3] + fVar276 * pfVar4[3]) - 0.0;
  fVar276 = fVar271 * fVar271;
  fVar429 = fVar269 * fVar269;
  fVar442 = fVar429 + fVar276 + fVar306;
  fVar446 = fVar429 + fVar276 + fVar306;
  fVar454 = fVar429 + fVar276 + fVar306;
  fVar429 = fVar429 + fVar276 + fVar306;
  fVar276 = *(float *)(ray + k * 4 + 0x40);
  fVar453 = ABS(fVar442);
  fVar350 = ABS(fVar446);
  fVar357 = ABS(fVar454);
  fVar373 = ABS(fVar429);
  fVar301 = *(float *)(ray + k * 4 + 0x30);
  fVar333 = fVar301 - fVar378;
  uVar126 = 1;
  fVar306 = 0.0;
  fVar320 = 1.0;
  pRVar117 = (RTCIntersectArguments *)0x0;
  do {
    fVar277 = fVar320 - fVar306;
    fVar474 = fVar277 * 0.0 + fVar306;
    fVar475 = fVar277 * 0.33333334 + fVar306;
    fVar476 = fVar277 * 0.6666667 + fVar306;
    fVar225 = fVar277 * 1.0 + fVar306;
    fVar417 = 1.0 - fVar474;
    fVar426 = 1.0 - fVar475;
    fVar427 = 1.0 - fVar476;
    fVar428 = 1.0 - fVar225;
    fVar307 = fVar458 * fVar417 + fVar388 * fVar474;
    fVar321 = fVar458 * fVar426 + fVar388 * fVar475;
    fVar323 = fVar458 * fVar427 + fVar388 * fVar476;
    fVar324 = fVar458 * fVar428 + fVar388 * fVar225;
    fVar278 = fVar461 * fVar417 + fVar375 * fVar474;
    fVar302 = fVar461 * fVar426 + fVar375 * fVar475;
    fVar304 = fVar461 * fVar427 + fVar375 * fVar476;
    fVar305 = fVar461 * fVar428 + fVar375 * fVar225;
    fVar229 = fVar272 * fVar417 + fVar390 * fVar474;
    fVar248 = fVar272 * fVar426 + fVar390 * fVar475;
    fVar250 = fVar272 * fVar427 + fVar390 * fVar476;
    fVar251 = fVar272 * fVar428 + fVar390 * fVar225;
    fVar337 = fVar274 * fVar417 + fVar227 * fVar474;
    fVar351 = fVar274 * fVar426 + fVar227 * fVar475;
    fVar353 = fVar274 * fVar427 + fVar227 * fVar476;
    fVar355 = fVar274 * fVar428 + fVar227 * fVar225;
    fVar459 = (fVar396 * fVar417 + fVar458 * fVar474) * fVar417 + fVar474 * fVar307;
    fVar462 = (fVar396 * fVar426 + fVar458 * fVar475) * fVar426 + fVar475 * fVar321;
    fVar464 = (fVar396 * fVar427 + fVar458 * fVar476) * fVar427 + fVar476 * fVar323;
    fVar466 = (fVar396 * fVar428 + fVar458 * fVar225) * fVar428 + fVar225 * fVar324;
    fVar379 = (fVar406 * fVar417 + fVar461 * fVar474) * fVar417 + fVar474 * fVar278;
    fVar389 = (fVar406 * fVar426 + fVar461 * fVar475) * fVar426 + fVar475 * fVar302;
    fVar391 = (fVar406 * fVar427 + fVar461 * fVar476) * fVar427 + fVar476 * fVar304;
    fVar393 = (fVar406 * fVar428 + fVar461 * fVar225) * fVar428 + fVar225 * fVar305;
    fVar253 = (fVar410 * fVar417 + fVar272 * fVar474) * fVar417 + fVar474 * fVar229;
    fVar270 = (fVar410 * fVar426 + fVar272 * fVar475) * fVar426 + fVar475 * fVar248;
    fVar273 = (fVar410 * fVar427 + fVar272 * fVar476) * fVar427 + fVar476 * fVar250;
    fVar275 = (fVar410 * fVar428 + fVar272 * fVar225) * fVar428 + fVar225 * fVar251;
    fVar325 = (fVar425 * fVar417 + fVar274 * fVar474) * fVar417 + fVar474 * fVar337;
    fVar334 = (fVar425 * fVar426 + fVar274 * fVar475) * fVar426 + fVar475 * fVar351;
    fVar335 = (fVar425 * fVar427 + fVar274 * fVar476) * fVar427 + fVar476 * fVar353;
    fVar336 = (fVar425 * fVar428 + fVar274 * fVar225) * fVar428 + fVar225 * fVar355;
    fVar307 = fVar307 * fVar417 + (fVar388 * fVar417 + (float)local_608._0_4_ * fVar474) * fVar474;
    fVar321 = fVar321 * fVar426 + (fVar388 * fVar426 + (float)local_608._0_4_ * fVar475) * fVar475;
    fVar323 = fVar323 * fVar427 + (fVar388 * fVar427 + (float)local_608._0_4_ * fVar476) * fVar476;
    fVar324 = fVar324 * fVar428 + (fVar388 * fVar428 + (float)local_608._0_4_ * fVar225) * fVar225;
    fVar278 = fVar278 * fVar417 + (fVar375 * fVar417 + (float)local_608._4_4_ * fVar474) * fVar474;
    fVar302 = fVar302 * fVar426 + (fVar375 * fVar426 + (float)local_608._4_4_ * fVar475) * fVar475;
    fVar304 = fVar304 * fVar427 + (fVar375 * fVar427 + (float)local_608._4_4_ * fVar476) * fVar476;
    fVar305 = fVar305 * fVar428 + (fVar375 * fVar428 + (float)local_608._4_4_ * fVar225) * fVar225;
    fVar229 = fVar229 * fVar417 + (fVar390 * fVar417 + fStack_600 * fVar474) * fVar474;
    fVar248 = fVar248 * fVar426 + (fVar390 * fVar426 + fStack_600 * fVar475) * fVar475;
    fVar250 = fVar250 * fVar427 + (fVar390 * fVar427 + fStack_600 * fVar476) * fVar476;
    fVar251 = fVar251 * fVar428 + (fVar390 * fVar428 + fStack_600 * fVar225) * fVar225;
    fVar338 = fVar337 * fVar417 + (fVar227 * fVar417 + fStack_5fc * fVar474) * fVar474;
    fVar352 = fVar351 * fVar426 + (fVar227 * fVar426 + fStack_5fc * fVar475) * fVar475;
    fVar354 = fVar353 * fVar427 + (fVar227 * fVar427 + fStack_5fc * fVar476) * fVar476;
    fVar356 = fVar355 * fVar428 + (fVar227 * fVar428 + fStack_5fc * fVar225) * fVar225;
    fVar397 = fVar417 * fVar459 + fVar474 * fVar307;
    fVar407 = fVar426 * fVar462 + fVar475 * fVar321;
    fVar411 = fVar427 * fVar464 + fVar476 * fVar323;
    fVar414 = fVar428 * fVar466 + fVar225 * fVar324;
    fVar455 = fVar417 * fVar379 + fVar474 * fVar278;
    fVar460 = fVar426 * fVar389 + fVar475 * fVar302;
    fVar463 = fVar427 * fVar391 + fVar476 * fVar304;
    fVar465 = fVar428 * fVar393 + fVar225 * fVar305;
    fVar430 = fVar417 * fVar253 + fVar474 * fVar229;
    fVar443 = fVar426 * fVar270 + fVar475 * fVar248;
    fVar447 = fVar427 * fVar273 + fVar476 * fVar250;
    fVar450 = fVar428 * fVar275 + fVar225 * fVar251;
    fVar358 = fVar277 * 0.11111111;
    fVar474 = fVar417 * fVar325 + fVar474 * fVar338;
    fVar475 = fVar426 * fVar334 + fVar475 * fVar352;
    auVar422._0_8_ = CONCAT44(fVar475,fVar474);
    auVar422._8_4_ = fVar427 * fVar335 + fVar476 * fVar354;
    auVar422._12_4_ = fVar428 * fVar336 + fVar225 * fVar356;
    fVar417 = (fVar307 - fVar459) * 3.0 * fVar358;
    fVar426 = (fVar321 - fVar462) * 3.0 * fVar358;
    fVar427 = (fVar323 - fVar464) * 3.0 * fVar358;
    fVar428 = (fVar324 - fVar466) * 3.0 * fVar358;
    fVar337 = (fVar278 - fVar379) * 3.0 * fVar358;
    fVar351 = (fVar302 - fVar389) * 3.0 * fVar358;
    fVar353 = (fVar304 - fVar391) * 3.0 * fVar358;
    fVar355 = (fVar305 - fVar393) * 3.0 * fVar358;
    fVar253 = (fVar229 - fVar253) * 3.0 * fVar358;
    fVar278 = (fVar248 - fVar270) * 3.0 * fVar358;
    fVar302 = (fVar250 - fVar273) * 3.0 * fVar358;
    fVar304 = (fVar251 - fVar275) * 3.0 * fVar358;
    fVar459 = fVar358 * (fVar352 - fVar334) * 3.0;
    fVar462 = fVar358 * (fVar354 - fVar335) * 3.0;
    fVar464 = fVar358 * (fVar356 - fVar336) * 3.0;
    auVar205._4_4_ = auVar422._8_4_;
    auVar205._0_4_ = fVar475;
    auVar205._8_4_ = auVar422._12_4_;
    auVar205._12_4_ = 0;
    local_6c8._4_4_ = fVar475 + fVar459;
    local_6c8._0_4_ = fVar474 + fVar358 * (fVar338 - fVar325) * 3.0;
    fStack_6c0 = auVar422._8_4_ + fVar462;
    fStack_6bc = auVar422._12_4_ + fVar464;
    auVar206._0_8_ = CONCAT44(auVar422._8_4_ - fVar462,fVar475 - fVar459);
    auVar206._8_4_ = auVar422._12_4_ - fVar464;
    auVar206._12_4_ = 0;
    fVar398 = fVar460 - fVar455;
    fVar408 = fVar463 - fVar460;
    fVar412 = fVar465 - fVar463;
    fVar415 = 0.0 - fVar465;
    fVar358 = fVar443 - fVar430;
    fVar389 = fVar447 - fVar443;
    fVar393 = fVar450 - fVar447;
    fVar394 = 0.0 - fVar450;
    fVar459 = fVar337 * fVar358 - fVar253 * fVar398;
    fVar462 = fVar351 * fVar389 - fVar278 * fVar408;
    fVar464 = fVar353 * fVar393 - fVar302 * fVar412;
    fVar466 = fVar355 * fVar394 - fVar304 * fVar415;
    auVar477._0_4_ = fVar407 - fVar397;
    auVar477._4_4_ = fVar411 - fVar407;
    auVar477._8_4_ = fVar414 - fVar411;
    auVar477._12_4_ = 0.0 - fVar414;
    fVar229 = fVar253 * auVar477._0_4_ - fVar417 * fVar358;
    fVar248 = fVar278 * auVar477._4_4_ - fVar426 * fVar389;
    fVar250 = fVar302 * auVar477._8_4_ - fVar427 * fVar393;
    fVar251 = fVar304 * auVar477._12_4_ - fVar428 * fVar394;
    fVar270 = fVar417 * fVar398 - fVar337 * auVar477._0_4_;
    fVar273 = fVar426 * fVar408 - fVar351 * auVar477._4_4_;
    fVar275 = fVar427 * fVar412 - fVar353 * auVar477._8_4_;
    fVar305 = fVar428 * fVar415 - fVar355 * auVar477._12_4_;
    auVar257._0_4_ = fVar358 * fVar358;
    auVar257._4_4_ = fVar389 * fVar389;
    auVar257._8_4_ = fVar393 * fVar393;
    auVar257._12_4_ = fVar394 * fVar394;
    auVar326._0_4_ = auVar477._0_4_ * auVar477._0_4_ + fVar398 * fVar398 + auVar257._0_4_;
    auVar326._4_4_ = auVar477._4_4_ * auVar477._4_4_ + fVar408 * fVar408 + auVar257._4_4_;
    auVar326._8_4_ = auVar477._8_4_ * auVar477._8_4_ + fVar412 * fVar412 + auVar257._8_4_;
    auVar326._12_4_ = auVar477._12_4_ * auVar477._12_4_ + fVar415 * fVar415 + auVar257._12_4_;
    auVar309 = rcpps(auVar257,auVar326);
    fVar474 = auVar309._0_4_;
    fVar475 = auVar309._4_4_;
    fVar476 = auVar309._8_4_;
    fVar225 = auVar309._12_4_;
    fVar474 = (1.0 - fVar474 * auVar326._0_4_) * fVar474 + fVar474;
    fVar475 = (1.0 - fVar475 * auVar326._4_4_) * fVar475 + fVar475;
    fVar476 = (1.0 - fVar476 * auVar326._8_4_) * fVar476 + fVar476;
    fVar225 = (1.0 - fVar225 * auVar326._12_4_) * fVar225 + fVar225;
    fVar307 = fVar358 * fVar351 - fVar398 * fVar278;
    fVar321 = fVar389 * fVar353 - fVar408 * fVar302;
    fVar323 = fVar393 * fVar355 - fVar412 * fVar304;
    fVar324 = fVar394 * 0.0 - fVar415 * 0.0;
    fVar325 = auVar477._0_4_ * fVar278 - fVar358 * fVar426;
    fVar334 = auVar477._4_4_ * fVar302 - fVar389 * fVar427;
    fVar335 = auVar477._8_4_ * fVar304 - fVar393 * fVar428;
    fVar336 = auVar477._12_4_ * 0.0 - fVar394 * 0.0;
    fVar338 = fVar398 * fVar426 - auVar477._0_4_ * fVar351;
    fVar352 = fVar408 * fVar427 - auVar477._4_4_ * fVar353;
    fVar354 = fVar412 * fVar428 - auVar477._8_4_ * fVar355;
    fVar356 = fVar415 * 0.0 - auVar477._12_4_ * 0.0;
    auVar471._0_4_ = fVar338 * fVar338;
    auVar471._4_4_ = fVar352 * fVar352;
    auVar471._8_4_ = fVar354 * fVar354;
    auVar471._12_4_ = fVar356 * fVar356;
    auVar173._0_4_ = (fVar459 * fVar459 + fVar229 * fVar229 + fVar270 * fVar270) * fVar474;
    auVar173._4_4_ = (fVar462 * fVar462 + fVar248 * fVar248 + fVar273 * fVar273) * fVar475;
    auVar173._8_4_ = (fVar464 * fVar464 + fVar250 * fVar250 + fVar275 * fVar275) * fVar476;
    auVar173._12_4_ = (fVar466 * fVar466 + fVar251 * fVar251 + fVar305 * fVar305) * fVar225;
    auVar363._0_4_ = (fVar307 * fVar307 + fVar325 * fVar325 + auVar471._0_4_) * fVar474;
    auVar363._4_4_ = (fVar321 * fVar321 + fVar334 * fVar334 + auVar471._4_4_) * fVar475;
    auVar363._8_4_ = (fVar323 * fVar323 + fVar335 * fVar335 + auVar471._8_4_) * fVar476;
    auVar363._12_4_ = (fVar324 * fVar324 + fVar336 * fVar336 + auVar471._12_4_) * fVar225;
    auVar309 = maxps(auVar173,auVar363);
    auVar346._8_4_ = auVar422._8_4_;
    auVar346._0_8_ = auVar422._0_8_;
    auVar346._12_4_ = auVar422._12_4_;
    auVar231 = maxps(auVar346,_local_6c8);
    auVar364._8_4_ = auVar206._8_4_;
    auVar364._0_8_ = auVar206._0_8_;
    auVar364._12_4_ = 0;
    auVar365 = maxps(auVar364,auVar205);
    auVar365 = maxps(auVar231,auVar365);
    auVar423 = minps(auVar422,_local_6c8);
    auVar231 = minps(auVar206,auVar205);
    auVar231 = minps(auVar423,auVar231);
    auVar309 = sqrtps(auVar309,auVar309);
    auVar423 = rsqrtps(auVar471,auVar326);
    fVar459 = auVar423._0_4_;
    fVar462 = auVar423._4_4_;
    fVar466 = auVar423._8_4_;
    fVar474 = auVar423._12_4_;
    fVar464 = fVar459 * fVar459 * auVar326._0_4_ * -0.5 * fVar459 + fVar459 * 1.5;
    fVar475 = fVar462 * fVar462 * auVar326._4_4_ * -0.5 * fVar462 + fVar462 * 1.5;
    fVar229 = fVar466 * fVar466 * auVar326._8_4_ * -0.5 * fVar466 + fVar466 * 1.5;
    fVar251 = fVar474 * fVar474 * auVar326._12_4_ * -0.5 * fVar474 + fVar474 * 1.5;
    fVar459 = 0.0 - fVar455;
    fVar466 = 0.0 - fVar460;
    fVar476 = 0.0 - fVar463;
    fVar248 = 0.0 - fVar465;
    fVar307 = 0.0 - fVar430;
    fVar323 = 0.0 - fVar443;
    fVar325 = 0.0 - fVar447;
    fVar335 = 0.0 - fVar450;
    fVar338 = 0.0 - fVar397;
    fVar352 = 0.0 - fVar407;
    fVar354 = 0.0 - fVar411;
    fVar356 = 0.0 - fVar414;
    fVar379 = fVar276 * auVar477._0_4_ * fVar464 +
              fVar271 * fVar398 * fVar464 + fVar303 * fVar358 * fVar464;
    fVar391 = fVar276 * auVar477._4_4_ * fVar475 +
              fVar271 * fVar408 * fVar475 + fVar303 * fVar389 * fVar475;
    fVar392 = fVar276 * auVar477._8_4_ * fVar229 +
              fVar271 * fVar412 * fVar229 + fVar303 * fVar393 * fVar229;
    fVar395 = fVar276 * auVar477._12_4_ * fVar251 +
              fVar271 * fVar415 * fVar251 + fVar303 * fVar394 * fVar251;
    fVar399 = auVar477._0_4_ * fVar464 * fVar338 +
              fVar398 * fVar464 * fVar459 + fVar358 * fVar464 * fVar307;
    fVar409 = auVar477._4_4_ * fVar475 * fVar352 +
              fVar408 * fVar475 * fVar466 + fVar389 * fVar475 * fVar323;
    fVar413 = auVar477._8_4_ * fVar229 * fVar354 +
              fVar412 * fVar229 * fVar476 + fVar393 * fVar229 * fVar325;
    fVar416 = auVar477._12_4_ * fVar251 * fVar356 +
              fVar415 * fVar251 * fVar248 + fVar394 * fVar251 * fVar335;
    fVar270 = (fVar276 * fVar338 + fVar271 * fVar459 + fVar303 * fVar307) - fVar379 * fVar399;
    fVar273 = (fVar276 * fVar352 + fVar271 * fVar466 + fVar303 * fVar323) - fVar391 * fVar409;
    fVar275 = (fVar276 * fVar354 + fVar271 * fVar476 + fVar303 * fVar325) - fVar392 * fVar413;
    fVar305 = (fVar276 * fVar356 + fVar271 * fVar248 + fVar303 * fVar335) - fVar395 * fVar416;
    fVar462 = (fVar338 * fVar338 + fVar459 * fVar459 + fVar307 * fVar307) - fVar399 * fVar399;
    fVar474 = (fVar352 * fVar352 + fVar466 * fVar466 + fVar323 * fVar323) - fVar409 * fVar409;
    fVar225 = (fVar354 * fVar354 + fVar476 * fVar476 + fVar325 * fVar325) - fVar413 * fVar413;
    fVar250 = (fVar356 * fVar356 + fVar248 * fVar248 + fVar335 * fVar335) - fVar416 * fVar416;
    fVar321 = (auVar365._0_4_ + auVar309._0_4_) * 1.0000002;
    fVar324 = (auVar365._4_4_ + auVar309._4_4_) * 1.0000002;
    fVar334 = (auVar365._8_4_ + auVar309._8_4_) * 1.0000002;
    fVar336 = (auVar365._12_4_ + auVar309._12_4_) * 1.0000002;
    fVar431 = fVar462 - fVar321 * fVar321;
    fVar444 = fVar474 - fVar324 * fVar324;
    fVar448 = fVar225 - fVar334 * fVar334;
    fVar451 = fVar250 - fVar336 * fVar336;
    auVar366._0_4_ = fVar442 - fVar379 * fVar379;
    auVar366._4_4_ = fVar446 - fVar391 * fVar391;
    auVar366._8_4_ = fVar454 - fVar392 * fVar392;
    auVar366._12_4_ = fVar429 - fVar395 * fVar395;
    fVar270 = fVar270 + fVar270;
    fVar273 = fVar273 + fVar273;
    fVar275 = fVar275 + fVar275;
    fVar305 = fVar305 + fVar305;
    auVar347._0_4_ = fVar270 * fVar270 - auVar366._0_4_ * 4.0 * fVar431;
    auVar347._4_4_ = fVar273 * fVar273 - auVar366._4_4_ * 4.0 * fVar444;
    auVar347._8_4_ = fVar275 * fVar275 - auVar366._8_4_ * 4.0 * fVar448;
    auVar347._12_4_ = fVar305 * fVar305 - auVar366._12_4_ * 4.0 * fVar451;
    auVar286._4_4_ = -(uint)(0.0 <= auVar347._4_4_);
    auVar286._0_4_ = -(uint)(0.0 <= auVar347._0_4_);
    auVar286._8_4_ = -(uint)(0.0 <= auVar347._8_4_);
    auVar286._12_4_ = -(uint)(0.0 <= auVar347._12_4_);
    iVar129 = movmskps((int)pSVar108,auVar286);
    auVar174._0_8_ = CONCAT44(fVar391 * fVar391,fVar379 * fVar379) & 0x7fffffff7fffffff;
    auVar174._8_4_ = ABS(fVar392 * fVar392);
    auVar174._12_4_ = ABS(fVar395 * fVar395);
    fVar321 = ABS(auVar366._0_4_);
    fVar324 = ABS(auVar366._4_4_);
    fVar334 = ABS(auVar366._8_4_);
    fVar336 = ABS(auVar366._12_4_);
    if (iVar129 == 0) {
      iVar129 = 0;
      auVar368 = _DAT_01f45a40;
      auVar472 = _DAT_01f45a30;
    }
    else {
      auVar423 = sqrtps(auVar477,auVar347);
      bVar119 = 0.0 <= auVar347._0_4_;
      uVar121 = -(uint)bVar119;
      bVar34 = 0.0 <= auVar347._4_4_;
      uVar123 = -(uint)bVar34;
      bVar35 = 0.0 <= auVar347._8_4_;
      uVar125 = -(uint)bVar35;
      bVar36 = 0.0 <= auVar347._12_4_;
      uVar127 = -(uint)bVar36;
      auVar207._0_4_ = auVar366._0_4_ + auVar366._0_4_;
      auVar207._4_4_ = auVar366._4_4_ + auVar366._4_4_;
      auVar207._8_4_ = auVar366._8_4_ + auVar366._8_4_;
      auVar207._12_4_ = auVar366._12_4_ + auVar366._12_4_;
      auVar365 = rcpps(auVar366,auVar207);
      fVar432 = auVar365._0_4_;
      fVar445 = auVar365._4_4_;
      fVar449 = auVar365._8_4_;
      fVar452 = auVar365._12_4_;
      fVar432 = (1.0 - auVar207._0_4_ * fVar432) * fVar432 + fVar432;
      fVar445 = (1.0 - auVar207._4_4_ * fVar445) * fVar445 + fVar445;
      fVar449 = (1.0 - auVar207._8_4_ * fVar449) * fVar449 + fVar449;
      fVar452 = (1.0 - auVar207._12_4_ * fVar452) * fVar452 + fVar452;
      fVar359 = (-fVar270 - auVar423._0_4_) * fVar432;
      fVar374 = (-fVar273 - auVar423._4_4_) * fVar445;
      fVar376 = (-fVar275 - auVar423._8_4_) * fVar449;
      fVar377 = (-fVar305 - auVar423._12_4_) * fVar452;
      fVar432 = (auVar423._0_4_ - fVar270) * fVar432;
      fVar445 = (auVar423._4_4_ - fVar273) * fVar445;
      fVar449 = (auVar423._8_4_ - fVar275) * fVar449;
      fVar452 = (auVar423._12_4_ - fVar305) * fVar452;
      local_228 = (fVar379 * fVar359 + fVar399) * fVar464;
      fStack_224 = (fVar391 * fVar374 + fVar409) * fVar475;
      fStack_220 = (fVar392 * fVar376 + fVar413) * fVar229;
      fStack_21c = (fVar395 * fVar377 + fVar416) * fVar251;
      local_218 = (fVar379 * fVar432 + fVar399) * fVar464;
      fStack_214 = (fVar391 * fVar445 + fVar409) * fVar475;
      fStack_210 = (fVar392 * fVar449 + fVar413) * fVar229;
      fStack_20c = (fVar395 * fVar452 + fVar416) * fVar251;
      auVar367._0_4_ = (uint)fVar359 & uVar121;
      auVar367._4_4_ = (uint)fVar374 & uVar123;
      auVar367._8_4_ = (uint)fVar376 & uVar125;
      auVar367._12_4_ = (uint)fVar377 & uVar127;
      auVar472._0_8_ = CONCAT44(~uVar123,~uVar121) & 0x7f8000007f800000;
      auVar472._8_4_ = ~uVar125 & 0x7f800000;
      auVar472._12_4_ = ~uVar127 & 0x7f800000;
      auVar472 = auVar472 | auVar367;
      auVar478._0_4_ = (uint)fVar432 & uVar121;
      auVar478._4_4_ = (uint)fVar445 & uVar123;
      auVar478._8_4_ = (uint)fVar449 & uVar125;
      auVar478._12_4_ = (uint)fVar452 & uVar127;
      auVar368._0_8_ = CONCAT44(~uVar123,~uVar121) & 0xff800000ff800000;
      auVar368._8_4_ = ~uVar125 & 0xff800000;
      auVar368._12_4_ = ~uVar127 & 0xff800000;
      auVar368 = auVar368 | auVar478;
      auVar74._4_4_ = fVar350;
      auVar74._0_4_ = fVar453;
      auVar74._8_4_ = fVar357;
      auVar74._12_4_ = fVar373;
      auVar365 = maxps(auVar74,auVar174);
      fVar432 = auVar365._0_4_ * 1.9073486e-06;
      fVar359 = auVar365._4_4_ * 1.9073486e-06;
      fVar445 = auVar365._8_4_ * 1.9073486e-06;
      fVar374 = auVar365._12_4_ * 1.9073486e-06;
      auVar479._0_4_ = -(uint)(fVar321 < fVar432 && bVar119);
      auVar479._4_4_ = -(uint)(fVar324 < fVar359 && bVar34);
      auVar479._8_4_ = -(uint)(fVar334 < fVar445 && bVar35);
      auVar479._12_4_ = -(uint)(fVar336 < fVar374 && bVar36);
      iVar129 = movmskps(iVar129,auVar479);
      if (iVar129 != 0) {
        uVar121 = -(uint)(fVar431 <= 0.0);
        uVar123 = -(uint)(fVar444 <= 0.0);
        uVar125 = -(uint)(fVar448 <= 0.0);
        uVar127 = -(uint)(fVar451 <= 0.0);
        local_638 = CONCAT44(~uVar123,~uVar121) & 0x7f8000007f800000;
        auVar287._0_4_ = (uVar121 & 0xff800000 | (uint)local_638) & auVar479._0_4_;
        auVar287._4_4_ = (uVar123 & 0xff800000 | local_638._4_4_) & auVar479._4_4_;
        auVar287._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & 0x7f800000) & auVar479._8_4_;
        auVar287._12_4_ = (uVar127 & 0xff800000 | ~uVar127 & 0x7f800000) & auVar479._12_4_;
        auVar457._0_4_ = ~auVar479._0_4_ & auVar472._0_4_;
        auVar457._4_4_ = ~auVar479._4_4_ & auVar472._4_4_;
        auVar457._8_4_ = ~auVar479._8_4_ & auVar472._8_4_;
        auVar457._12_4_ = ~auVar479._12_4_ & auVar472._12_4_;
        auVar473._0_4_ = (uVar121 & 0x7f800000 | ~uVar121 & 0xff800000) & auVar479._0_4_;
        auVar473._4_4_ = (uVar123 & 0x7f800000 | ~uVar123 & 0xff800000) & auVar479._4_4_;
        auVar473._8_4_ = (uVar125 & 0x7f800000 | ~uVar125 & 0xff800000) & auVar479._8_4_;
        auVar473._12_4_ = (uVar127 & 0x7f800000 | ~uVar127 & 0xff800000) & auVar479._12_4_;
        auVar480._0_4_ = ~auVar479._0_4_ & auVar368._0_4_;
        auVar480._4_4_ = ~auVar479._4_4_ & auVar368._4_4_;
        auVar480._8_4_ = ~auVar479._8_4_ & auVar368._8_4_;
        auVar480._12_4_ = ~auVar479._12_4_ & auVar368._12_4_;
        auVar286._4_4_ = -(uint)((fVar359 <= fVar324 || fVar444 <= 0.0) && bVar34);
        auVar286._0_4_ = -(uint)((fVar432 <= fVar321 || fVar431 <= 0.0) && bVar119);
        auVar286._8_4_ = -(uint)((fVar445 <= fVar334 || fVar448 <= 0.0) && bVar35);
        auVar286._12_4_ = -(uint)((fVar374 <= fVar336 || fVar451 <= 0.0) && bVar36);
        auVar368 = auVar480 | auVar473;
        auVar472 = auVar457 | auVar287;
      }
    }
    auVar288._0_4_ = (auVar286._0_4_ << 0x1f) >> 0x1f;
    auVar288._4_4_ = (auVar286._4_4_ << 0x1f) >> 0x1f;
    auVar288._8_4_ = (auVar286._8_4_ << 0x1f) >> 0x1f;
    auVar288._12_4_ = (auVar286._12_4_ << 0x1f) >> 0x1f;
    auVar288 = auVar288 & auVar204;
    iVar129 = movmskps(iVar129,auVar288);
    pRVar113 = pRVar112;
    if (iVar129 != 0) {
      fVar431 = *(float *)(ray + k * 4 + 0x80);
      auVar289._0_4_ = fVar431 - fVar378;
      auVar289._4_4_ = auVar289._0_4_;
      auVar289._8_4_ = auVar289._0_4_;
      auVar289._12_4_ = auVar289._0_4_;
      auVar423 = minps(auVar289,auVar368);
      auVar78._4_4_ = fVar333;
      auVar78._0_4_ = fVar333;
      auVar78._8_4_ = fVar333;
      auVar78._12_4_ = fVar333;
      auVar440 = maxps(auVar78,auVar472);
      auVar175._0_4_ = fVar459 * fVar337 + fVar307 * fVar253;
      auVar175._4_4_ = fVar466 * fVar351 + fVar323 * fVar278;
      auVar175._8_4_ = fVar476 * fVar353 + fVar325 * fVar302;
      auVar175._12_4_ = fVar248 * fVar355 + fVar335 * fVar304;
      auVar232._0_4_ = fVar417 * fVar276 + fVar337 * fVar271 + fVar253 * fVar303;
      auVar232._4_4_ = fVar426 * fVar276 + fVar351 * fVar271 + fVar278 * fVar303;
      auVar232._8_4_ = fVar427 * fVar276 + fVar353 * fVar271 + fVar302 * fVar303;
      auVar232._12_4_ = fVar428 * fVar276 + fVar355 * fVar271 + fVar304 * fVar303;
      auVar365 = rcpps(auVar175,auVar232);
      fVar459 = auVar365._0_4_;
      fVar466 = auVar365._4_4_;
      fVar476 = auVar365._8_4_;
      fVar248 = auVar365._12_4_;
      fVar459 = ((1.0 - auVar232._0_4_ * fVar459) * fVar459 + fVar459) *
                -(fVar338 * fVar417 + auVar175._0_4_);
      fVar466 = ((1.0 - auVar232._4_4_ * fVar466) * fVar466 + fVar466) *
                -(fVar352 * fVar426 + auVar175._4_4_);
      fVar476 = ((1.0 - auVar232._8_4_ * fVar476) * fVar476 + fVar476) *
                -(fVar354 * fVar427 + auVar175._8_4_);
      fVar248 = ((1.0 - auVar232._12_4_ * fVar248) * fVar248 + fVar248) *
                -(fVar356 * fVar428 + auVar175._12_4_);
      fVar253 = 0.0;
      fVar307 = 0.0;
      fVar323 = 0.0;
      fVar325 = 0.0;
      uVar121 = -(uint)(auVar232._0_4_ < 0.0 || ABS(auVar232._0_4_) < 1e-18);
      uVar123 = -(uint)(auVar232._4_4_ < 0.0 || ABS(auVar232._4_4_) < 1e-18);
      uVar125 = -(uint)(auVar232._8_4_ < 0.0 || ABS(auVar232._8_4_) < 1e-18);
      uVar127 = -(uint)(auVar232._12_4_ < 0.0 || ABS(auVar232._12_4_) < 1e-18);
      auVar327._0_4_ = (uint)DAT_01f45a40 & uVar121;
      auVar327._4_4_ = DAT_01f45a40._4_4_ & uVar123;
      auVar327._8_4_ = DAT_01f45a40._8_4_ & uVar125;
      auVar327._12_4_ = DAT_01f45a40._12_4_ & uVar127;
      auVar176._0_4_ = ~uVar121 & (uint)fVar459;
      auVar176._4_4_ = ~uVar123 & (uint)fVar466;
      auVar176._8_4_ = ~uVar125 & (uint)fVar476;
      auVar176._12_4_ = ~uVar127 & (uint)fVar248;
      auVar440 = maxps(auVar440,auVar176 | auVar327);
      uVar121 = -(uint)(0.0 < auVar232._0_4_ || ABS(auVar232._0_4_) < 1e-18);
      uVar123 = -(uint)(0.0 < auVar232._4_4_ || ABS(auVar232._4_4_) < 1e-18);
      uVar125 = -(uint)(0.0 < auVar232._8_4_ || ABS(auVar232._8_4_) < 1e-18);
      uVar127 = -(uint)(0.0 < auVar232._12_4_ || ABS(auVar232._12_4_) < 1e-18);
      auVar177._0_8_ = CONCAT44(uVar123,uVar121) & 0x7f8000007f800000;
      auVar177._8_4_ = uVar125 & 0x7f800000;
      auVar177._12_4_ = uVar127 & 0x7f800000;
      auVar233._0_4_ = ~uVar121 & (uint)fVar459;
      auVar233._4_4_ = ~uVar123 & (uint)fVar466;
      auVar233._8_4_ = ~uVar125 & (uint)fVar476;
      auVar233._12_4_ = ~uVar127 & (uint)fVar248;
      auVar365 = minps(auVar423,auVar233 | auVar177);
      auVar311._0_4_ = (0.0 - fVar460) * -fVar351 + (0.0 - fVar443) * -fVar278;
      auVar311._4_4_ = (0.0 - fVar463) * -fVar353 + (0.0 - fVar447) * -fVar302;
      auVar311._8_4_ = (0.0 - fVar465) * -fVar355 + (0.0 - fVar450) * -fVar304;
      auVar311._12_4_ = 0x80000000;
      auVar258._0_4_ = -fVar426 * fVar276 + -fVar351 * fVar271 + -fVar278 * fVar303;
      auVar258._4_4_ = -fVar427 * fVar276 + -fVar353 * fVar271 + -fVar302 * fVar303;
      auVar258._8_4_ = -fVar428 * fVar276 + -fVar355 * fVar271 + -fVar304 * fVar303;
      auVar258._12_4_ = fVar276 * -0.0 + fVar271 * -0.0 + fVar303 * -0.0;
      auVar423 = rcpps(auVar311,auVar258);
      fVar459 = auVar423._0_4_;
      fVar466 = auVar423._4_4_;
      fVar476 = auVar423._8_4_;
      fVar248 = auVar423._12_4_;
      auVar328._4_4_ = -(uint)(ABS(auVar258._4_4_) < 1e-18);
      auVar328._0_4_ = -(uint)(ABS(auVar258._0_4_) < 1e-18);
      auVar328._8_4_ = -(uint)(ABS(auVar258._8_4_) < 1e-18);
      auVar328._12_4_ = -(uint)(ABS(auVar258._12_4_) < 1e-18);
      fVar459 = (((float)DAT_01f46a60 - auVar258._0_4_ * fVar459) * fVar459 + fVar459) *
                -((0.0 - fVar407) * -fVar426 + auVar311._0_4_);
      fVar466 = ((DAT_01f46a60._4_4_ - auVar258._4_4_ * fVar466) * fVar466 + fVar466) *
                -((0.0 - fVar411) * -fVar427 + auVar311._4_4_);
      fVar476 = ((DAT_01f46a60._8_4_ - auVar258._8_4_ * fVar476) * fVar476 + fVar476) *
                -((0.0 - fVar414) * -fVar428 + auVar311._8_4_);
      fVar248 = ((DAT_01f46a60._12_4_ - auVar258._12_4_ * fVar248) * fVar248 + fVar248) * 0.0;
      auVar178._4_4_ = -(uint)(auVar258._4_4_ < 0.0);
      auVar178._0_4_ = -(uint)(auVar258._0_4_ < 0.0);
      auVar178._8_4_ = -(uint)(auVar258._8_4_ < 0.0);
      auVar178._12_4_ = -(uint)(auVar258._12_4_ < 0.0);
      auVar178 = auVar178 | auVar328;
      auVar312._0_4_ = (uint)DAT_01f45a40 & auVar178._0_4_;
      auVar312._4_4_ = DAT_01f45a40._4_4_ & auVar178._4_4_;
      auVar312._8_4_ = DAT_01f45a40._8_4_ & auVar178._8_4_;
      auVar312._12_4_ = DAT_01f45a40._12_4_ & auVar178._12_4_;
      auVar179._0_4_ = ~auVar178._0_4_ & (uint)fVar459;
      auVar179._4_4_ = ~auVar178._4_4_ & (uint)fVar466;
      auVar179._8_4_ = ~auVar178._8_4_ & (uint)fVar476;
      auVar179._12_4_ = ~auVar178._12_4_ & (uint)fVar248;
      auVar423 = maxps(auVar440,auVar179 | auVar312);
      auVar259._4_4_ = -(uint)(0.0 < auVar258._4_4_);
      auVar259._0_4_ = -(uint)(0.0 < auVar258._0_4_);
      auVar259._8_4_ = -(uint)(0.0 < auVar258._8_4_);
      auVar259._12_4_ = -(uint)(0.0 < auVar258._12_4_);
      auVar259 = auVar259 | auVar328;
      auVar404._0_8_ = auVar259._0_8_ & 0x7f8000007f800000;
      auVar404._8_4_ = auVar259._8_4_ & 0x7f800000;
      auVar404._12_4_ = auVar259._12_4_ & 0x7f800000;
      auVar260._0_4_ = ~auVar259._0_4_ & (uint)fVar459;
      auVar260._4_4_ = ~auVar259._4_4_ & (uint)fVar466;
      auVar260._8_4_ = ~auVar259._8_4_ & (uint)fVar476;
      auVar260._12_4_ = ~auVar259._12_4_ & (uint)fVar248;
      aVar290 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar365,auVar260 | auVar404);
      fVar459 = auVar423._12_4_;
      fVar466 = auVar423._0_4_;
      fVar476 = auVar423._4_4_;
      fVar248 = auVar423._8_4_;
      local_588._0_4_ = auVar288._0_4_;
      local_588._4_4_ = auVar288._4_4_;
      fStack_580 = auVar288._8_4_;
      fStack_57c = auVar288._12_4_;
      auVar481._0_4_ = -(uint)(fVar466 <= aVar290.v[0]) & local_588._0_4_;
      auVar481._4_4_ = -(uint)(fVar476 <= aVar290.v[1]) & local_588._4_4_;
      auVar481._8_4_ = -(uint)(fVar248 <= aVar290.v[2]) & (uint)fStack_580;
      auVar481._12_4_ = -(uint)(fVar459 <= aVar290.v[3]) & (uint)fStack_57c;
      iVar129 = movmskps(iVar129,auVar481);
      if (iVar129 != 0) {
        auVar69._4_4_ = (auVar231._4_4_ - auVar309._4_4_) * 0.99999976;
        auVar69._0_4_ = (auVar231._0_4_ - auVar309._0_4_) * 0.99999976;
        auVar69._8_4_ = (auVar231._8_4_ - auVar309._8_4_) * 0.99999976;
        auVar69._12_4_ = (auVar231._12_4_ - auVar309._12_4_) * 0.99999976;
        auVar231 = maxps(ZEXT816(0),auVar69);
        auVar76._4_4_ = fStack_224;
        auVar76._0_4_ = local_228;
        auVar76._8_4_ = fStack_220;
        auVar76._12_4_ = fStack_21c;
        auVar309 = minps(auVar76,_DAT_01f46a60);
        auVar291._0_12_ = ZEXT812(0);
        auVar291._12_4_ = 0;
        auVar365 = maxps(auVar309,auVar291);
        auVar77._4_4_ = fStack_214;
        auVar77._0_4_ = local_218;
        auVar77._8_4_ = fStack_210;
        auVar77._12_4_ = fStack_20c;
        auVar309 = minps(auVar77,_DAT_01f46a60);
        auVar309 = maxps(auVar309,auVar291);
        local_108[0] = (auVar365._0_4_ + 0.0) * 0.25 * fVar277 + fVar306;
        local_108[1] = (auVar365._4_4_ + 1.0) * 0.25 * fVar277 + fVar306;
        local_108[2] = (auVar365._8_4_ + 2.0) * 0.25 * fVar277 + fVar306;
        local_108[3] = (auVar365._12_4_ + 3.0) * 0.25 * fVar277 + fVar306;
        local_118[0] = (auVar309._0_4_ + 0.0) * 0.25 * fVar277 + fVar306;
        local_118[1] = (auVar309._4_4_ + 1.0) * 0.25 * fVar277 + fVar306;
        local_118[2] = (auVar309._8_4_ + 2.0) * 0.25 * fVar277 + fVar306;
        local_118[3] = (auVar309._12_4_ + 3.0) * 0.25 * fVar277 + fVar306;
        fVar462 = fVar462 - auVar231._0_4_ * auVar231._0_4_;
        fVar474 = fVar474 - auVar231._4_4_ * auVar231._4_4_;
        fVar225 = fVar225 - auVar231._8_4_ * auVar231._8_4_;
        fVar250 = fVar250 - auVar231._12_4_ * auVar231._12_4_;
        auVar234._0_4_ = auVar366._0_4_ * 4.0 * fVar462;
        auVar234._4_4_ = auVar366._4_4_ * 4.0 * fVar474;
        auVar234._8_4_ = auVar366._8_4_ * 4.0 * fVar225;
        auVar234._12_4_ = auVar366._12_4_ * 4.0 * fVar250;
        auVar208._0_4_ = fVar270 * fVar270 - auVar234._0_4_;
        auVar208._4_4_ = fVar273 * fVar273 - auVar234._4_4_;
        auVar208._8_4_ = fVar275 * fVar275 - auVar234._8_4_;
        auVar208._12_4_ = fVar305 * fVar305 - auVar234._12_4_;
        auVar441._4_4_ = -(uint)(0.0 <= auVar208._4_4_);
        auVar441._0_4_ = -(uint)(0.0 <= auVar208._0_4_);
        auVar441._8_4_ = -(uint)(0.0 <= auVar208._8_4_);
        auVar441._12_4_ = -(uint)(0.0 <= auVar208._12_4_);
        iVar129 = movmskps(iVar129,auVar441);
        if (iVar129 == 0) {
          _local_668 = ZEXT816(0);
          fVar275 = 0.0;
          fVar304 = 0.0;
          fVar305 = 0.0;
          fVar335 = 0.0;
          fVar464 = 0.0;
          fVar475 = 0.0;
          fVar229 = 0.0;
          fVar251 = 0.0;
          fVar270 = 0.0;
          fVar278 = 0.0;
          fVar273 = 0.0;
          fVar302 = 0.0;
          _local_588 = ZEXT816(0);
          iVar129 = 0;
          auVar348 = _DAT_01f45a40;
          auVar369 = _DAT_01f45a30;
        }
        else {
          auVar231 = sqrtps(auVar291,auVar208);
          auVar180._0_4_ = auVar366._0_4_ + auVar366._0_4_;
          auVar180._4_4_ = auVar366._4_4_ + auVar366._4_4_;
          auVar180._8_4_ = auVar366._8_4_ + auVar366._8_4_;
          auVar180._12_4_ = auVar366._12_4_ + auVar366._12_4_;
          auVar309 = rcpps(auVar234,auVar180);
          fVar277 = auVar309._0_4_;
          fVar337 = auVar309._4_4_;
          fVar351 = auVar309._8_4_;
          fVar353 = auVar309._12_4_;
          fVar277 = ((float)DAT_01f46a60 - auVar180._0_4_ * fVar277) * fVar277 + fVar277;
          fVar337 = (DAT_01f46a60._4_4_ - auVar180._4_4_ * fVar337) * fVar337 + fVar337;
          fVar351 = (DAT_01f46a60._8_4_ - auVar180._8_4_ * fVar351) * fVar351 + fVar351;
          fVar353 = (DAT_01f46a60._12_4_ - auVar180._12_4_ * fVar353) * fVar353 + fVar353;
          fVar355 = (-fVar270 - auVar231._0_4_) * fVar277;
          fVar417 = (-fVar273 - auVar231._4_4_) * fVar337;
          fVar426 = (-fVar275 - auVar231._8_4_) * fVar351;
          fVar427 = (-fVar305 - auVar231._12_4_) * fVar353;
          fVar277 = (auVar231._0_4_ - fVar270) * fVar277;
          fVar337 = (auVar231._4_4_ - fVar273) * fVar337;
          fVar351 = (auVar231._8_4_ - fVar275) * fVar351;
          fVar353 = (auVar231._12_4_ - fVar305) * fVar353;
          fVar275 = (fVar379 * fVar355 + fVar399) * fVar464;
          fVar304 = (fVar391 * fVar417 + fVar409) * fVar475;
          fVar305 = (fVar392 * fVar426 + fVar413) * fVar229;
          fVar335 = (fVar395 * fVar427 + fVar416) * fVar251;
          fVar270 = fVar276 * fVar355 - (auVar477._0_4_ * fVar275 + fVar397);
          fVar278 = fVar276 * fVar417 - (auVar477._4_4_ * fVar304 + fVar407);
          fVar273 = fVar276 * fVar426 - (auVar477._8_4_ * fVar305 + fVar411);
          fVar302 = fVar276 * fVar427 - (auVar477._12_4_ * fVar335 + fVar414);
          fVar253 = fVar271 * fVar355 - (fVar398 * fVar275 + fVar455);
          fVar307 = fVar271 * fVar417 - (fVar408 * fVar304 + fVar460);
          fVar323 = fVar271 * fVar426 - (fVar412 * fVar305 + fVar463);
          fVar325 = fVar271 * fVar427 - (fVar415 * fVar335 + fVar465);
          local_588._4_4_ = fVar303 * fVar417 - (fVar304 * fVar389 + fVar443);
          local_588._0_4_ = fVar303 * fVar355 - (fVar275 * fVar358 + fVar430);
          fStack_580 = fVar303 * fVar426 - (fVar305 * fVar393 + fVar447);
          fStack_57c = fVar303 * fVar427 - (fVar335 * fVar394 + fVar450);
          fVar464 = (fVar379 * fVar277 + fVar399) * fVar464;
          fVar475 = (fVar391 * fVar337 + fVar409) * fVar475;
          fVar229 = (fVar392 * fVar351 + fVar413) * fVar229;
          fVar251 = (fVar395 * fVar353 + fVar416) * fVar251;
          local_668._4_4_ = fVar276 * fVar337 - (auVar477._4_4_ * fVar475 + fVar407);
          local_668._0_4_ = fVar276 * fVar277 - (auVar477._0_4_ * fVar464 + fVar397);
          fStack_660 = fVar276 * fVar351 - (auVar477._8_4_ * fVar229 + fVar411);
          fStack_65c = fVar276 * fVar353 - (auVar477._12_4_ * fVar251 + fVar414);
          fVar275 = fVar271 * fVar277 - (fVar398 * fVar464 + fVar455);
          fVar304 = fVar271 * fVar337 - (fVar408 * fVar475 + fVar460);
          fVar305 = fVar271 * fVar351 - (fVar412 * fVar229 + fVar463);
          fVar335 = fVar271 * fVar353 - (fVar415 * fVar251 + fVar465);
          bVar119 = 0.0 <= auVar208._0_4_;
          uVar121 = -(uint)bVar119;
          bVar34 = 0.0 <= auVar208._4_4_;
          uVar123 = -(uint)bVar34;
          bVar35 = 0.0 <= auVar208._8_4_;
          uVar125 = -(uint)bVar35;
          bVar36 = 0.0 <= auVar208._12_4_;
          uVar127 = -(uint)bVar36;
          fVar464 = fVar303 * fVar277 - (fVar464 * fVar358 + fVar430);
          fVar475 = fVar303 * fVar337 - (fVar475 * fVar389 + fVar443);
          fVar229 = fVar303 * fVar351 - (fVar229 * fVar393 + fVar447);
          fVar251 = fVar303 * fVar353 - (fVar251 * fVar394 + fVar450);
          auVar424._0_4_ = (uint)fVar355 & uVar121;
          auVar424._4_4_ = (uint)fVar417 & uVar123;
          auVar424._8_4_ = (uint)fVar426 & uVar125;
          auVar424._12_4_ = (uint)fVar427 & uVar127;
          auVar369._0_8_ = CONCAT44(~uVar123,~uVar121) & 0x7f8000007f800000;
          auVar369._8_4_ = ~uVar125 & 0x7f800000;
          auVar369._12_4_ = ~uVar127 & 0x7f800000;
          auVar369 = auVar369 | auVar424;
          auVar292._0_4_ = (uint)fVar277 & uVar121;
          auVar292._4_4_ = (uint)fVar337 & uVar123;
          auVar292._8_4_ = (uint)fVar351 & uVar125;
          auVar292._12_4_ = (uint)fVar353 & uVar127;
          auVar348._0_8_ = CONCAT44(~uVar123,~uVar121) & 0xff800000ff800000;
          auVar348._8_4_ = ~uVar125 & 0xff800000;
          auVar348._12_4_ = ~uVar127 & 0xff800000;
          auVar348 = auVar348 | auVar292;
          auVar75._4_4_ = fVar350;
          auVar75._0_4_ = fVar453;
          auVar75._8_4_ = fVar357;
          auVar75._12_4_ = fVar373;
          auVar309 = maxps(auVar75,auVar174);
          fVar277 = auVar309._0_4_ * 1.9073486e-06;
          fVar337 = auVar309._4_4_ * 1.9073486e-06;
          fVar351 = auVar309._8_4_ * 1.9073486e-06;
          fVar353 = auVar309._12_4_ * 1.9073486e-06;
          auVar293._0_4_ = -(uint)(fVar321 < fVar277 && bVar119);
          auVar293._4_4_ = -(uint)(fVar324 < fVar337 && bVar34);
          auVar293._8_4_ = -(uint)(fVar334 < fVar351 && bVar35);
          auVar293._12_4_ = -(uint)(fVar336 < fVar353 && bVar36);
          iVar129 = movmskps(iVar129,auVar293);
          if (iVar129 != 0) {
            uVar121 = -(uint)(fVar462 <= 0.0);
            uVar123 = -(uint)(fVar474 <= 0.0);
            uVar125 = -(uint)(fVar225 <= 0.0);
            uVar127 = -(uint)(fVar250 <= 0.0);
            auVar387._0_4_ = (uVar121 & 0xff800000 | ~uVar121 & (uint)DAT_01f45a30) & auVar293._0_4_
            ;
            auVar387._4_4_ = (uVar123 & 0xff800000 | ~uVar123 & DAT_01f45a30._4_4_) & auVar293._4_4_
            ;
            auVar387._8_4_ = (uVar125 & 0xff800000 | ~uVar125 & DAT_01f45a30._8_4_) & auVar293._8_4_
            ;
            auVar387._12_4_ =
                 (uVar127 & 0xff800000 | ~uVar127 & DAT_01f45a30._12_4_) & auVar293._12_4_;
            auVar405._0_4_ = ~auVar293._0_4_ & auVar369._0_4_;
            auVar405._4_4_ = ~auVar293._4_4_ & auVar369._4_4_;
            auVar405._8_4_ = ~auVar293._8_4_ & auVar369._8_4_;
            auVar405._12_4_ = ~auVar293._12_4_ & auVar369._12_4_;
            auVar372._0_4_ = (uVar121 & (uint)DAT_01f45a30 | ~uVar121 & 0xff800000) & auVar293._0_4_
            ;
            auVar372._4_4_ = (uVar123 & DAT_01f45a30._4_4_ | ~uVar123 & 0xff800000) & auVar293._4_4_
            ;
            auVar372._8_4_ = (uVar125 & DAT_01f45a30._8_4_ | ~uVar125 & 0xff800000) & auVar293._8_4_
            ;
            auVar372._12_4_ =
                 (uVar127 & DAT_01f45a30._12_4_ | ~uVar127 & 0xff800000) & auVar293._12_4_;
            auVar300._0_4_ = ~auVar293._0_4_ & auVar348._0_4_;
            auVar300._4_4_ = ~auVar293._4_4_ & auVar348._4_4_;
            auVar300._8_4_ = ~auVar293._8_4_ & auVar348._8_4_;
            auVar300._12_4_ = ~auVar293._12_4_ & auVar348._12_4_;
            auVar441._4_4_ = -(uint)((fVar337 <= fVar324 || fVar474 <= 0.0) && bVar34);
            auVar441._0_4_ = -(uint)((fVar277 <= fVar321 || fVar462 <= 0.0) && bVar119);
            auVar441._8_4_ = -(uint)((fVar351 <= fVar334 || fVar225 <= 0.0) && bVar35);
            auVar441._12_4_ = -(uint)((fVar353 <= fVar336 || fVar250 <= 0.0) && bVar36);
            auVar348 = auVar300 | auVar372;
            auVar369 = auVar405 | auVar387;
          }
        }
        fVar462 = (float)DAT_01f4be20;
        fVar474 = DAT_01f4be20._4_4_;
        fVar225 = DAT_01f4be20._8_4_;
        fVar250 = DAT_01f4be20._12_4_;
        auVar309 = minps((undefined1  [16])aVar290,auVar369);
        aVar370 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar423,auVar348);
        tp1.lower.field_0 = aVar370;
        tp1.upper.field_0 = aVar290;
        auVar349._0_8_ =
             CONCAT44(-(uint)(fVar476 <= auVar309._4_4_) & auVar481._4_4_,
                      -(uint)(fVar466 <= auVar309._0_4_) & auVar481._0_4_);
        auVar349._8_4_ = -(uint)(fVar248 <= auVar309._8_4_) & auVar481._8_4_;
        auVar349._12_4_ = -(uint)(fVar459 <= auVar309._12_4_) & auVar481._12_4_;
        uVar121 = -(uint)(aVar370.v[0] <= aVar290.v[0]) & auVar481._0_4_;
        uVar123 = -(uint)(aVar370.v[1] <= aVar290.v[1]) & auVar481._4_4_;
        auVar181._4_4_ = uVar123;
        auVar181._0_4_ = uVar121;
        uVar125 = -(uint)(aVar370.v[2] <= aVar290.v[2]) & auVar481._8_4_;
        uVar127 = -(uint)(aVar370.v[3] <= aVar290.v[3]) & auVar481._12_4_;
        auVar181._8_4_ = uVar125;
        auVar181._12_4_ = uVar127;
        iVar129 = movmskps(iVar129,auVar181 | auVar349);
        uVar109 = CONCAT44((int)((ulong)pSVar108 >> 0x20),iVar129);
        if (iVar129 != 0) {
          auVar209._0_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar462 <=
                                     ABS((float)local_588._0_4_ * fVar303 + fVar253 * fVar271 +
                                         fVar270 * fVar276)) & auVar441._0_4_) << 0x1f) >> 0x1f) + 4
                      );
          auVar209._4_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar474 <=
                                     ABS((float)local_588._4_4_ * fVar303 + fVar307 * fVar271 +
                                         fVar278 * fVar276)) & auVar441._4_4_) << 0x1f) >> 0x1f) + 4
                      );
          auVar209._8_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar225 <=
                                     ABS(fStack_580 * fVar303 + fVar323 * fVar271 +
                                         fVar273 * fVar276)) & auVar441._8_4_) << 0x1f) >> 0x1f) + 4
                      );
          auVar209._12_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar250 <=
                                     ABS(fStack_57c * fVar303 + fVar325 * fVar271 +
                                         fVar302 * fVar276)) & auVar441._12_4_) << 0x1f) >> 0x1f) +
                      4);
          auVar182 = ~auVar209 & auVar349;
          auVar294._8_4_ = auVar349._8_4_;
          auVar294._0_8_ = auVar349._0_8_;
          auVar294._12_4_ = auVar349._12_4_;
          auVar371._4_4_ = fVar406;
          auVar371._0_4_ = fVar396;
          auVar371._8_4_ = fVar410;
          auVar371._12_4_ = fVar425;
          while( true ) {
            vVar103.field_0 = tp1.lower.field_0;
            local_398 = auVar182;
            uVar106 = (undefined4)(uVar109 >> 0x20);
            iVar129 = movmskps((int)uVar109,auVar182);
            uVar109 = CONCAT44(uVar106,iVar129);
            if (iVar129 == 0) break;
            uVar105 = auVar182._0_4_;
            uVar197 = auVar182._4_4_;
            uVar199 = auVar182._8_4_;
            uVar200 = auVar182._12_4_;
            auVar210._0_4_ = uVar105 & (uint)fVar466;
            auVar210._4_4_ = uVar197 & (uint)fVar476;
            auVar210._8_4_ = uVar199 & (uint)fVar248;
            auVar210._12_4_ = uVar200 & (uint)fVar459;
            auVar235._0_8_ = CONCAT44(~uVar197,~uVar105) & 0x7f8000007f800000;
            auVar235._8_4_ = ~uVar199 & 0x7f800000;
            auVar235._12_4_ = ~uVar200 & 0x7f800000;
            auVar235 = auVar235 | auVar210;
            auVar261._4_4_ = auVar235._0_4_;
            auVar261._0_4_ = auVar235._4_4_;
            auVar261._8_4_ = auVar235._12_4_;
            auVar261._12_4_ = auVar235._8_4_;
            auVar309 = minps(auVar261,auVar235);
            auVar211._0_8_ = auVar309._8_8_;
            auVar211._8_4_ = auVar309._0_4_;
            auVar211._12_4_ = auVar309._4_4_;
            auVar309 = minps(auVar211,auVar309);
            auVar212._0_8_ =
                 CONCAT44(-(uint)(auVar309._4_4_ == auVar235._4_4_) & uVar197,
                          -(uint)(auVar309._0_4_ == auVar235._0_4_) & uVar105);
            auVar212._8_4_ = -(uint)(auVar309._8_4_ == auVar235._8_4_) & uVar199;
            auVar212._12_4_ = -(uint)(auVar309._12_4_ == auVar235._12_4_) & uVar200;
            iVar129 = movmskps(iVar129,auVar212);
            if (iVar129 != 0) {
              auVar182._8_4_ = auVar212._8_4_;
              auVar182._0_8_ = auVar212._0_8_;
              auVar182._12_4_ = auVar212._12_4_;
            }
            uVar104 = movmskps(iVar129,auVar182);
            uVar110 = CONCAT44(uVar106,uVar104);
            uVar109 = 0;
            if (uVar110 != 0) {
              for (; (uVar110 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            *(undefined4 *)(local_398 + uVar109 * 4) = 0;
            auVar72._4_4_ = fVar461;
            auVar72._0_4_ = fVar458;
            auVar72._8_4_ = fVar272;
            auVar72._12_4_ = fVar274;
            auVar231 = minps(auVar371,auVar72);
            auVar365 = maxps(auVar371,auVar72);
            auVar70._4_4_ = fVar375;
            auVar70._0_4_ = fVar388;
            auVar70._8_4_ = fVar390;
            auVar70._12_4_ = fVar227;
            auVar309 = minps(auVar70,_local_608);
            auVar231 = minps(auVar231,auVar309);
            auVar309 = maxps(auVar70,_local_608);
            auVar365 = maxps(auVar365,auVar309);
            auVar236._0_8_ = auVar231._0_8_ & 0x7fffffff7fffffff;
            auVar236._8_4_ = auVar231._8_4_ & 0x7fffffff;
            auVar236._12_4_ = auVar231._12_4_ & 0x7fffffff;
            auVar183._0_8_ = auVar365._0_8_ & 0x7fffffff7fffffff;
            auVar183._8_4_ = auVar365._8_4_ & 0x7fffffff;
            auVar183._12_4_ = ABS(auVar365._12_4_);
            auVar309 = maxps(auVar236,auVar183);
            fVar253 = auVar309._4_4_;
            if (auVar309._4_4_ <= auVar309._0_4_) {
              fVar253 = auVar309._0_4_;
            }
            auVar237._8_8_ = auVar309._8_8_;
            auVar237._0_8_ = auVar309._8_8_;
            if (auVar309._8_4_ <= fVar253) {
              auVar237._0_4_ = fVar253;
            }
            fVar278 = auVar237._0_4_ * 1.9073486e-06;
            fVar253 = local_108[uVar109];
            fVar270 = local_118[uVar109 - 8];
            lVar114 = 5;
            do {
              bVar119 = lVar114 == 0;
              lVar114 = lVar114 + -1;
              if (bVar119) goto LAB_0035c4b7;
              fVar323 = SQRT(fVar322) * 1.9073486e-06 * fVar270;
              fVar273 = 1.0 - fVar253;
              fVar307 = fVar458 * fVar273 + fVar388 * fVar253;
              fVar321 = fVar461 * fVar273 + fVar375 * fVar253;
              fVar324 = fVar272 * fVar273 + fVar390 * fVar253;
              fVar334 = fVar274 * fVar273 + fVar227 * fVar253;
              fVar325 = (auVar371._0_4_ * fVar273 + fVar458 * fVar253) * fVar273 + fVar253 * fVar307
              ;
              fVar336 = (auVar371._4_4_ * fVar273 + fVar461 * fVar253) * fVar273 + fVar253 * fVar321
              ;
              fVar277 = (auVar371._8_4_ * fVar273 + fVar272 * fVar253) * fVar273 + fVar253 * fVar324
              ;
              fVar302 = (auVar371._12_4_ * fVar273 + fVar274 * fVar253) * fVar273 +
                        fVar253 * fVar334;
              fVar351 = fVar307 * fVar273 +
                        (fVar388 * fVar273 + (float)local_608._0_4_ * fVar253) * fVar253;
              fVar355 = fVar321 * fVar273 +
                        (fVar375 * fVar273 + (float)local_608._4_4_ * fVar253) * fVar253;
              fVar426 = fVar324 * fVar273 + (fVar390 * fVar273 + fStack_600 * fVar253) * fVar253;
              fVar307 = fVar334 * fVar273 + (fVar227 * fVar273 + fStack_5fc * fVar253) * fVar253;
              fVar338 = fVar273 * fVar302 + fVar253 * fVar307;
              fVar353 = (fVar351 - fVar325) * 3.0;
              fVar417 = (fVar355 - fVar336) * 3.0;
              fVar427 = (fVar426 - fVar277) * 3.0;
              fVar428 = (fVar307 - fVar302) * 3.0;
              fVar302 = fVar273 * 6.0;
              fVar334 = (fVar253 - (fVar273 + fVar273)) * 6.0;
              fVar337 = (fVar273 - (fVar253 + fVar253)) * 6.0;
              fVar324 = fVar253 * 6.0;
              fVar307 = fVar302 * auVar371._0_4_ +
                        fVar334 * fVar458 + fVar337 * fVar388 + fVar324 * (float)local_608._0_4_;
              fVar321 = fVar302 * auVar371._4_4_ +
                        fVar334 * fVar461 + fVar337 * fVar375 + fVar324 * (float)local_608._4_4_;
              fVar302 = fVar302 * auVar371._8_4_ +
                        fVar334 * fVar272 + fVar337 * fVar390 + fVar324 * fStack_600;
              fVar334 = (fVar270 * fVar269 + 0.0) - (fVar273 * fVar325 + fVar253 * fVar351);
              fVar336 = (fVar270 * fVar271 + 0.0) - (fVar273 * fVar336 + fVar253 * fVar355);
              fVar277 = (fVar270 * fVar303 + 0.0) - (fVar273 * fVar277 + fVar253 * fVar426);
              fVar355 = (fVar270 * 0.0 + 0.0) - fVar338;
              fVar273 = fVar336 * fVar336;
              fVar324 = fVar277 * fVar277;
              fVar325 = fVar355 * fVar355;
              fVar337 = fVar273 + fVar334 * fVar334 + fVar324;
              fVar351 = fVar273 + fVar273 + fVar325;
              auVar482._4_4_ = fVar351;
              auVar482._0_4_ = fVar337;
              fVar324 = fVar273 + fVar324 + fVar324;
              fVar325 = fVar273 + fVar325 + fVar325;
              fVar273 = fVar278;
              if (fVar278 <= fVar323) {
                fVar273 = fVar323;
              }
              fVar426 = fVar417 * fVar417 + fVar353 * fVar353 + fVar427 * fVar427;
              auVar309 = ZEXT416((uint)fVar426);
              auVar231 = rsqrtss(ZEXT416((uint)fVar426),auVar309);
              fVar323 = auVar231._0_4_;
              fVar352 = fVar323 * 1.5 - fVar323 * fVar323 * fVar426 * 0.5 * fVar323;
              fVar393 = fVar353 * fVar352;
              fVar392 = fVar417 * fVar352;
              fVar394 = fVar427 * fVar352;
              fVar395 = fVar428 * fVar352;
              fVar391 = fVar427 * fVar302 + fVar417 * fVar321 + fVar353 * fVar307;
              auVar309 = rcpss(auVar309,auVar309);
              fVar323 = (2.0 - fVar426 * auVar309._0_4_) * auVar309._0_4_;
              fVar354 = fVar336 * fVar392;
              fVar356 = fVar277 * fVar394;
              fVar358 = fVar355 * fVar395;
              fVar379 = fVar354 + fVar334 * fVar393 + fVar356;
              fVar389 = fVar354 + fVar354 + fVar358;
              fVar356 = fVar354 + fVar356 + fVar356;
              fVar358 = fVar354 + fVar358 + fVar358;
              fVar354 = (SQRT(fVar337) + 1.0) * (fVar278 / SQRT(fVar426)) +
                        SQRT(fVar337) * fVar278 + fVar273;
              fVar397 = fVar395 * -fVar428;
              fVar426 = fVar394 * -fVar427 + fVar392 * -fVar417 + fVar393 * -fVar353 +
                        fVar323 * (fVar426 * fVar302 - fVar391 * fVar427) * fVar352 * fVar277 +
                        fVar323 * (fVar426 * fVar321 - fVar391 * fVar417) * fVar352 * fVar336 +
                        fVar323 * (fVar426 * fVar307 - fVar391 * fVar353) * fVar352 * fVar334;
              fVar321 = fVar303 * fVar394 + fVar271 * fVar392 + fVar269 * fVar393;
              auVar482._8_4_ = fVar324;
              auVar482._12_4_ = fVar325;
              fVar302 = fVar337 - fVar379 * fVar379;
              auVar184._0_8_ = CONCAT44(fVar351 - fVar389 * fVar389,fVar302);
              auVar184._8_4_ = fVar324 - fVar356 * fVar356;
              auVar184._12_4_ = fVar325 - fVar358 * fVar358;
              fVar323 = -fVar428 * fVar355;
              auVar213._8_4_ = auVar184._8_4_;
              auVar213._0_8_ = auVar184._0_8_;
              auVar213._12_4_ = auVar184._12_4_;
              auVar309 = rsqrtss(auVar213,auVar184);
              fVar307 = auVar309._0_4_;
              fVar307 = fVar307 * 1.5 - fVar307 * fVar307 * fVar302 * 0.5 * fVar307;
              if (fVar302 < 0.0) {
                fVar302 = sqrtf(fVar302);
                uVar109 = extraout_RAX;
                pRVar115 = extraout_RDX;
              }
              else {
                fVar302 = SQRT(fVar302);
              }
              fVar302 = fVar302 - fVar338;
              fVar324 = ((-fVar427 * fVar277 + -fVar417 * fVar336 + -fVar353 * fVar334) -
                        fVar379 * fVar426) * fVar307 - fVar428;
              fVar307 = ((fVar303 * fVar277 + fVar271 * fVar336 + fVar269 * fVar334) -
                        fVar379 * fVar321) * fVar307;
              auVar314._4_4_ = fVar397;
              auVar314._0_4_ = fVar426;
              auVar262._0_4_ = fVar426 * fVar307 - fVar321 * fVar324;
              auVar296._8_4_ = -fVar323;
              auVar296._0_8_ = CONCAT44(fVar323,fVar324) ^ 0x8000000000000000;
              auVar296._12_4_ = fVar355 * 0.0;
              auVar295._8_8_ = auVar296._8_8_;
              auVar295._0_8_ = CONCAT44(fVar307,fVar324) ^ 0x80000000;
              auVar262._4_4_ = auVar262._0_4_;
              auVar262._8_4_ = auVar262._0_4_;
              auVar262._12_4_ = auVar262._0_4_;
              auVar309 = divps(auVar295,auVar262);
              auVar314._8_4_ = fVar397;
              auVar314._12_4_ = -(fVar395 * 0.0);
              auVar313._8_8_ = auVar314._8_8_;
              auVar313._0_8_ = CONCAT44(fVar321,fVar426) ^ 0x8000000000000000;
              auVar231 = divps(auVar313,auVar262);
              fVar270 = fVar270 - (fVar302 * auVar231._0_4_ + fVar379 * auVar309._0_4_);
              fVar253 = fVar253 - (fVar302 * auVar231._4_4_ + fVar379 * auVar309._4_4_);
            } while ((fVar354 <= ABS(fVar379)) ||
                    (auVar365._12_4_ * 1.9073486e-06 + fVar273 + fVar354 <= ABS(fVar302)));
            fVar270 = fVar378 + fVar270;
            if ((fVar301 <= fVar270) &&
               (((fVar278 = *(float *)(ray + k * 4 + 0x80), fVar270 <= fVar278 && (0.0 <= fVar253))
                && (fVar253 <= 1.0)))) {
              auVar309 = rsqrtss(auVar482,auVar482);
              fVar273 = auVar309._0_4_;
              pGVar29 = (context->scene->geometries).items[(long)pRVar116].ptr;
              uVar109 = (ulong)*(uint *)(ray + k * 4 + 0x90);
              pRVar112 = pRVar116;
              if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar273 = fVar273 * 1.5 + fVar273 * fVar273 * fVar337 * -0.5 * fVar273;
                fVar334 = fVar334 * fVar273;
                fVar336 = fVar336 * fVar273;
                fVar277 = fVar277 * fVar273;
                fVar273 = fVar428 * fVar334 + fVar353;
                fVar302 = fVar428 * fVar336 + fVar417;
                fVar307 = fVar428 * fVar277 + fVar427;
                fVar323 = fVar336 * fVar353 - fVar417 * fVar334;
                fVar324 = fVar277 * fVar417 - fVar427 * fVar336;
                fVar325 = fVar334 * fVar427 - fVar353 * fVar277;
                fVar321 = fVar302 * fVar324 - fVar325 * fVar273;
                fVar302 = fVar307 * fVar325 - fVar323 * fVar302;
                fVar273 = fVar273 * fVar323 - fVar324 * fVar307;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar270;
                  *(float *)(ray + k * 4 + 0xc0) = fVar302;
                  *(float *)(ray + k * 4 + 0xd0) = fVar273;
                  *(float *)(ray + k * 4 + 0xe0) = fVar321;
                  *(float *)(ray + k * 4 + 0xf0) = fVar253;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar124;
                  *(uint *)(ray + k * 4 + 0x120) = uVar122;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar105 = context->user->instPrimID[0];
                  uVar109 = (ulong)uVar105;
                  *(uint *)(ray + k * 4 + 0x140) = uVar105;
                  pRVar112 = (RTCIntersectArguments *)context;
                }
                else {
                  local_388._4_4_ = fVar302;
                  local_388._0_4_ = fVar302;
                  fStack_380 = fVar302;
                  fStack_37c = fVar302;
                  local_378 = fVar273;
                  fStack_374 = fVar273;
                  fStack_370 = fVar273;
                  fStack_36c = fVar273;
                  local_368 = fVar321;
                  fStack_364 = fVar321;
                  fStack_360 = fVar321;
                  fStack_35c = fVar321;
                  local_358 = fVar253;
                  fStack_354 = fVar253;
                  fStack_350 = fVar253;
                  fStack_34c = fVar253;
                  local_348 = 0;
                  uStack_344 = 0;
                  uStack_340 = 0;
                  uStack_33c = 0;
                  local_338 = CONCAT44(uVar124,uVar124);
                  uStack_330 = CONCAT44(uVar124,uVar124);
                  local_328 = CONCAT44(uVar122,uVar122);
                  uStack_320 = CONCAT44(uVar122,uVar122);
                  local_318.flags = context->user->instID[0];
                  local_318.feature_mask = local_318.flags;
                  local_318.context._0_4_ = local_318.flags;
                  local_318.context._4_4_ = local_318.flags;
                  local_318.filter._0_4_ = context->user->instPrimID[0];
                  local_318.filter._4_4_ = (uint)local_318.filter;
                  local_318.intersect._0_4_ = (uint)local_318.filter;
                  local_318.intersect._4_4_ = (uint)local_318.filter;
                  *(float *)(ray + k * 4 + 0x80) = fVar270;
                  local_5c8 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_5c8;
                  args.geometryUserPtr = pGVar29->userPtr;
                  args.context = context->user;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)local_388;
                  args.N = 4;
                  p_Var33 = pGVar29->intersectionFilterN;
                  auVar483._8_8_ = &local_318;
                  auVar483._0_8_ = p_Var33;
                  pRVar112 = (RTCIntersectArguments *)context;
                  if (p_Var33 != (RTCFilterFunctionN)0x0) {
                    auVar483 = (*p_Var33)(&args);
                  }
                  pRVar115 = auVar483._8_8_;
                  auVar214._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                  auVar214._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                  auVar214._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                  auVar214._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                  uVar105 = movmskps(auVar483._0_4_,auVar214);
                  pRVar111 = (RTCRayN *)(ulong)(uVar105 ^ 0xf);
                  if ((uVar105 ^ 0xf) == 0) {
                    auVar214 = auVar214 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar112 = context->args;
                    pRVar113 = (RTCIntersectArguments *)pRVar112->filter;
                    auVar101._8_8_ = pRVar115;
                    auVar101._0_8_ = pRVar113;
                    auVar484._8_8_ = pRVar115;
                    auVar484._0_8_ = pRVar113;
                    if ((pRVar113 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar112->flags & 2) != 0 ||
                        (auVar484 = auVar101, ((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar484 = (*(code *)pRVar113)(&args);
                    }
                    pRVar115 = auVar484._8_8_;
                    auVar185._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                    auVar185._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                    auVar185._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                    auVar185._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                    auVar214 = auVar185 ^ _DAT_01f46b70;
                    uVar105 = movmskps(auVar484._0_4_,auVar185);
                    pRVar111 = (RTCRayN *)(ulong)(uVar105 ^ 0xf);
                    if ((uVar105 ^ 0xf) != 0) {
                      auVar238._0_4_ = *(uint *)(args.ray + 0xc0) & auVar185._0_4_;
                      auVar238._4_4_ = *(uint *)(args.ray + 0xc4) & auVar185._4_4_;
                      auVar238._8_4_ = *(uint *)(args.ray + 200) & auVar185._8_4_;
                      auVar238._12_4_ = *(uint *)(args.ray + 0xcc) & auVar185._12_4_;
                      auVar329._0_4_ = ~auVar185._0_4_ & *(uint *)args.hit;
                      auVar329._4_4_ = ~auVar185._4_4_ & *(uint *)(args.hit + 4);
                      auVar329._8_4_ = ~auVar185._8_4_ & *(uint *)(args.hit + 8);
                      auVar329._12_4_ = ~auVar185._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar329 | auVar238;
                      uVar105 = *(uint *)(args.hit + 0x14);
                      uVar197 = *(uint *)(args.hit + 0x18);
                      uVar199 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar185._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar185._4_4_ & uVar105 | *(uint *)(args.ray + 0xd4) & auVar185._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar185._8_4_ & uVar197 | *(uint *)(args.ray + 0xd8) & auVar185._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar185._12_4_ & uVar199 | *(uint *)(args.ray + 0xdc) & auVar185._12_4_
                      ;
                      uVar105 = *(uint *)(args.hit + 0x24);
                      uVar197 = *(uint *)(args.hit + 0x28);
                      uVar199 = *(uint *)(args.hit + 0x2c);
                      *(uint *)(args.ray + 0xe0) =
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x20) |
                           *(uint *)(args.ray + 0xe0) & auVar185._0_4_;
                      *(uint *)(args.ray + 0xe4) =
                           ~auVar185._4_4_ & uVar105 | *(uint *)(args.ray + 0xe4) & auVar185._4_4_;
                      *(uint *)(args.ray + 0xe8) =
                           ~auVar185._8_4_ & uVar197 | *(uint *)(args.ray + 0xe8) & auVar185._8_4_;
                      *(uint *)(args.ray + 0xec) =
                           ~auVar185._12_4_ & uVar199 | *(uint *)(args.ray + 0xec) & auVar185._12_4_
                      ;
                      auVar315._0_4_ = *(uint *)(args.ray + 0xf0) & auVar185._0_4_;
                      auVar315._4_4_ = *(uint *)(args.ray + 0xf4) & auVar185._4_4_;
                      auVar315._8_4_ = *(uint *)(args.ray + 0xf8) & auVar185._8_4_;
                      auVar315._12_4_ = *(uint *)(args.ray + 0xfc) & auVar185._12_4_;
                      auVar239._0_4_ = ~auVar185._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar239._4_4_ = ~auVar185._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar239._8_4_ = ~auVar185._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar239._12_4_ = ~auVar185._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar239 | auVar315;
                      uVar105 = *(uint *)(args.hit + 0x44);
                      uVar197 = *(uint *)(args.hit + 0x48);
                      uVar199 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar185._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar185._4_4_ & uVar105 | *(uint *)(args.ray + 0x104) & auVar185._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar185._8_4_ & uVar197 | *(uint *)(args.ray + 0x108) & auVar185._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar185._12_4_ & uVar199 |
                           *(uint *)(args.ray + 0x10c) & auVar185._12_4_;
                      uVar105 = *(uint *)(args.hit + 0x54);
                      uVar197 = *(uint *)(args.hit + 0x58);
                      uVar199 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar185._0_4_ |
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar185._4_4_ | ~auVar185._4_4_ & uVar105;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar185._8_4_ | ~auVar185._8_4_ & uVar197;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar185._12_4_ |
                           ~auVar185._12_4_ & uVar199;
                      uVar105 = *(uint *)(args.hit + 100);
                      uVar197 = *(uint *)(args.hit + 0x68);
                      uVar199 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar185._0_4_ |
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar185._4_4_ | ~auVar185._4_4_ & uVar105;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar185._8_4_ | ~auVar185._8_4_ & uVar197;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar185._12_4_ | ~auVar185._12_4_ & uVar199;
                      uVar105 = *(uint *)(args.hit + 0x74);
                      uVar197 = *(uint *)(args.hit + 0x78);
                      uVar199 = *(uint *)(args.hit + 0x7c);
                      *(uint *)(args.ray + 0x130) =
                           ~auVar185._0_4_ & *(uint *)(args.hit + 0x70) |
                           *(uint *)(args.ray + 0x130) & auVar185._0_4_;
                      *(uint *)(args.ray + 0x134) =
                           ~auVar185._4_4_ & uVar105 | *(uint *)(args.ray + 0x134) & auVar185._4_4_;
                      *(uint *)(args.ray + 0x138) =
                           ~auVar185._8_4_ & uVar197 | *(uint *)(args.ray + 0x138) & auVar185._8_4_;
                      *(uint *)(args.ray + 0x13c) =
                           ~auVar185._12_4_ & uVar199 |
                           *(uint *)(args.ray + 0x13c) & auVar185._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar185 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar185;
                      pRVar111 = args.ray;
                      pRVar112 = (RTCIntersectArguments *)args.hit;
                    }
                  }
                  auVar215._0_4_ = auVar214._0_4_ << 0x1f;
                  auVar215._4_4_ = auVar214._4_4_ << 0x1f;
                  auVar215._8_4_ = auVar214._8_4_ << 0x1f;
                  auVar215._12_4_ = auVar214._12_4_ << 0x1f;
                  iVar129 = movmskps((int)pRVar111,auVar215);
                  uVar109 = CONCAT44((int)((ulong)pRVar111 >> 0x20),iVar129);
                  if (iVar129 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar278;
                  }
                }
              }
            }
LAB_0035c4b7:
            fVar431 = *(float *)(ray + k * 4 + 0x80);
            auVar182._0_4_ = -(uint)(fVar378 + fVar466 <= fVar431) & local_398._0_4_;
            auVar182._4_4_ = -(uint)(fVar378 + fVar476 <= fVar431) & local_398._4_4_;
            auVar182._8_4_ = -(uint)(fVar378 + fVar248 <= fVar431) & local_398._8_4_;
            auVar182._12_4_ = -(uint)(fVar378 + fVar459 <= fVar431) & local_398._12_4_;
            auVar294 = auVar349;
          }
          auVar240._0_4_ = -(uint)(aVar370.v[0] + fVar378 <= fVar431) & uVar121;
          auVar240._4_4_ = -(uint)(aVar370.v[1] + fVar378 <= fVar431) & uVar123;
          auVar240._8_4_ = -(uint)(aVar370.v[2] + fVar378 <= fVar431) & uVar125;
          auVar240._12_4_ = -(uint)(aVar370.v[3] + fVar378 <= fVar431) & uVar127;
          auVar186._0_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar462 <=
                                     ABS((float)local_668._0_4_ * fVar276 +
                                         fVar275 * fVar271 + fVar464 * fVar303)) & auVar441._0_4_)
                            << 0x1f) >> 0x1f) + 4);
          auVar186._4_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar474 <=
                                     ABS((float)local_668._4_4_ * fVar276 +
                                         fVar304 * fVar271 + fVar475 * fVar303)) & auVar441._4_4_)
                            << 0x1f) >> 0x1f) + 4);
          auVar186._8_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar225 <=
                                     ABS(fStack_660 * fVar276 +
                                         fVar305 * fVar271 + fVar229 * fVar303)) & auVar441._8_4_)
                            << 0x1f) >> 0x1f) + 4);
          auVar186._12_4_ =
               -(uint)((int)uVar126 <
                      ((int)((-(uint)(fVar250 <=
                                     ABS(fStack_65c * fVar276 +
                                         fVar335 * fVar271 + fVar251 * fVar303)) & auVar441._12_4_)
                            << 0x1f) >> 0x1f) + 4);
          auVar187 = ~auVar186 & auVar240;
          fVar462 = fVar378 + tp1.lower.field_0.v[0];
          fVar464 = fVar378 + tp1.lower.field_0.v[1];
          fVar474 = fVar378 + tp1.lower.field_0.v[2];
          fVar475 = fVar378 + tp1.lower.field_0.v[3];
          while( true ) {
            local_3a8 = auVar187;
            iVar129 = movmskps((int)uVar109,auVar187);
            if (iVar129 == 0) break;
            auVar231 = ~auVar187 & _DAT_01f45a30 | auVar187 & (undefined1  [16])vVar103.field_0;
            auVar263._4_4_ = auVar231._0_4_;
            auVar263._0_4_ = auVar231._4_4_;
            auVar263._8_4_ = auVar231._12_4_;
            auVar263._12_4_ = auVar231._8_4_;
            auVar309 = minps(auVar263,auVar231);
            auVar216._0_8_ = auVar309._8_8_;
            auVar216._8_4_ = auVar309._0_4_;
            auVar216._12_4_ = auVar309._4_4_;
            auVar309 = minps(auVar216,auVar309);
            auVar217._0_8_ =
                 CONCAT44(-(uint)(auVar309._4_4_ == auVar231._4_4_) & auVar187._4_4_,
                          -(uint)(auVar309._0_4_ == auVar231._0_4_) & auVar187._0_4_);
            auVar217._8_4_ = -(uint)(auVar309._8_4_ == auVar231._8_4_) & auVar187._8_4_;
            auVar217._12_4_ = -(uint)(auVar309._12_4_ == auVar231._12_4_) & auVar187._12_4_;
            iVar129 = movmskps(iVar129,auVar217);
            if (iVar129 != 0) {
              auVar187._8_4_ = auVar217._8_4_;
              auVar187._0_8_ = auVar217._0_8_;
              auVar187._12_4_ = auVar217._12_4_;
            }
            uVar106 = movmskps(iVar129,auVar187);
            uVar110 = CONCAT44((int)(uVar109 >> 0x20),uVar106);
            uVar109 = 0;
            if (uVar110 != 0) {
              for (; (uVar110 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            *(undefined4 *)(local_3a8 + uVar109 * 4) = 0;
            auVar73._4_4_ = fVar461;
            auVar73._0_4_ = fVar458;
            auVar73._8_4_ = fVar272;
            auVar73._12_4_ = fVar274;
            auVar231 = minps(auVar371,auVar73);
            auVar365 = maxps(auVar371,auVar73);
            auVar71._4_4_ = fVar375;
            auVar71._0_4_ = fVar388;
            auVar71._8_4_ = fVar390;
            auVar71._12_4_ = fVar227;
            auVar309 = minps(auVar71,_local_608);
            auVar231 = minps(auVar231,auVar309);
            auVar309 = maxps(auVar71,_local_608);
            auVar365 = maxps(auVar365,auVar309);
            auVar241._0_8_ = auVar231._0_8_ & 0x7fffffff7fffffff;
            auVar241._8_4_ = auVar231._8_4_ & 0x7fffffff;
            auVar241._12_4_ = auVar231._12_4_ & 0x7fffffff;
            auVar188._0_8_ = auVar365._0_8_ & 0x7fffffff7fffffff;
            auVar188._8_4_ = auVar365._8_4_ & 0x7fffffff;
            auVar188._12_4_ = ABS(auVar365._12_4_);
            auVar309 = maxps(auVar241,auVar188);
            fVar225 = auVar309._4_4_;
            if (auVar309._4_4_ <= auVar309._0_4_) {
              fVar225 = auVar309._0_4_;
            }
            auVar242._8_8_ = auVar309._8_8_;
            auVar242._0_8_ = auVar309._8_8_;
            if (auVar309._8_4_ <= fVar225) {
              auVar242._0_4_ = fVar225;
            }
            fVar250 = auVar242._0_4_ * 1.9073486e-06;
            fVar225 = local_118[uVar109];
            fVar229 = tp1.upper.field_0.v[uVar109];
            lVar114 = 5;
            do {
              bVar119 = lVar114 == 0;
              lVar114 = lVar114 + -1;
              if (bVar119) goto LAB_0035cfd6;
              fVar273 = SQRT(fVar322) * 1.9073486e-06 * fVar229;
              fVar251 = 1.0 - fVar225;
              fVar270 = fVar458 * fVar251 + fVar388 * fVar225;
              fVar278 = fVar461 * fVar251 + fVar375 * fVar225;
              fVar302 = fVar272 * fVar251 + fVar390 * fVar225;
              fVar304 = fVar274 * fVar251 + fVar227 * fVar225;
              fVar275 = (auVar371._0_4_ * fVar251 + fVar458 * fVar225) * fVar251 + fVar225 * fVar270
              ;
              fVar305 = (auVar371._4_4_ * fVar251 + fVar461 * fVar225) * fVar251 + fVar225 * fVar278
              ;
              fVar307 = (auVar371._8_4_ * fVar251 + fVar272 * fVar225) * fVar251 + fVar225 * fVar302
              ;
              fVar253 = (auVar371._12_4_ * fVar251 + fVar274 * fVar225) * fVar251 +
                        fVar225 * fVar304;
              fVar323 = fVar270 * fVar251 +
                        (fVar388 * fVar251 + (float)local_608._0_4_ * fVar225) * fVar225;
              fVar325 = fVar278 * fVar251 +
                        (fVar375 * fVar251 + (float)local_608._4_4_ * fVar225) * fVar225;
              fVar335 = fVar302 * fVar251 + (fVar390 * fVar251 + fStack_600 * fVar225) * fVar225;
              fVar270 = fVar304 * fVar251 + (fVar227 * fVar251 + fStack_5fc * fVar225) * fVar225;
              fVar337 = fVar251 * fVar253 + fVar225 * fVar270;
              fVar324 = (fVar323 - fVar275) * 3.0;
              fVar334 = (fVar325 - fVar305) * 3.0;
              fVar336 = (fVar335 - fVar307) * 3.0;
              fVar277 = (fVar270 - fVar253) * 3.0;
              fVar253 = fVar251 * 6.0;
              fVar304 = (fVar225 - (fVar251 + fVar251)) * 6.0;
              fVar321 = (fVar251 - (fVar225 + fVar225)) * 6.0;
              fVar302 = fVar225 * 6.0;
              fVar270 = fVar253 * auVar371._0_4_ +
                        fVar304 * fVar458 + fVar321 * fVar388 + fVar302 * (float)local_608._0_4_;
              fVar278 = fVar253 * auVar371._4_4_ +
                        fVar304 * fVar461 + fVar321 * fVar375 + fVar302 * (float)local_608._4_4_;
              fVar253 = fVar253 * auVar371._8_4_ +
                        fVar304 * fVar272 + fVar321 * fVar390 + fVar302 * fStack_600;
              fVar302 = (fVar229 * fVar269 + 0.0) - (fVar251 * fVar275 + fVar225 * fVar323);
              fVar275 = (fVar229 * fVar271 + 0.0) - (fVar251 * fVar305 + fVar225 * fVar325);
              fVar304 = (fVar229 * fVar303 + 0.0) - (fVar251 * fVar307 + fVar225 * fVar335);
              fVar305 = (fVar229 * 0.0 + 0.0) - fVar337;
              fVar251 = fVar275 * fVar275;
              fStack_480 = fVar304 * fVar304;
              fStack_47c = fVar305 * fVar305;
              local_488._0_4_ = fVar251 + fVar302 * fVar302 + fStack_480;
              local_488._4_4_ = fVar251 + fVar251 + fStack_47c;
              fStack_480 = fVar251 + fStack_480 + fStack_480;
              fStack_47c = fVar251 + fStack_47c + fStack_47c;
              fVar251 = fVar250;
              if (fVar250 <= fVar273) {
                fVar251 = fVar273;
              }
              fVar307 = fVar334 * fVar334 + fVar324 * fVar324 + fVar336 * fVar336;
              auVar309 = ZEXT416((uint)fVar307);
              auVar231 = rsqrtss(ZEXT416((uint)fVar307),auVar309);
              fVar273 = auVar231._0_4_;
              fVar321 = fVar273 * 1.5 - fVar273 * fVar273 * fVar307 * 0.5 * fVar273;
              fVar353 = fVar324 * fVar321;
              fVar355 = fVar334 * fVar321;
              fVar417 = fVar336 * fVar321;
              fVar426 = fVar277 * fVar321;
              fVar351 = fVar336 * fVar253 + fVar334 * fVar278 + fVar324 * fVar270;
              auVar309 = rcpss(auVar309,auVar309);
              fVar273 = (2.0 - fVar307 * auVar309._0_4_) * auVar309._0_4_;
              fVar323 = fVar275 * fVar355;
              fVar325 = fVar304 * fVar417;
              fVar335 = fVar305 * fVar426;
              fVar428 = fVar323 + fVar302 * fVar353 + fVar325;
              fVar338 = fVar323 + fVar323 + fVar335;
              fVar325 = fVar323 + fVar325 + fVar325;
              fVar335 = fVar323 + fVar335 + fVar335;
              fVar323 = (SQRT((float)local_488._0_4_) + 1.0) * (fVar250 / SQRT(fVar307)) +
                        SQRT((float)local_488._0_4_) * fVar250 + fVar251;
              fVar427 = fVar426 * -fVar277;
              fVar307 = fVar417 * -fVar336 + fVar355 * -fVar334 + fVar353 * -fVar324 +
                        fVar273 * (fVar307 * fVar253 - fVar351 * fVar336) * fVar321 * fVar304 +
                        fVar273 * (fVar307 * fVar278 - fVar351 * fVar334) * fVar321 * fVar275 +
                        fVar273 * (fVar307 * fVar270 - fVar351 * fVar324) * fVar321 * fVar302;
              fVar273 = fVar303 * fVar417 + fVar271 * fVar355 + fVar269 * fVar353;
              fVar253 = (float)local_488._0_4_ - fVar428 * fVar428;
              auVar189._0_8_ = CONCAT44((float)local_488._4_4_ - fVar338 * fVar338,fVar253);
              auVar189._8_4_ = fStack_480 - fVar325 * fVar325;
              auVar189._12_4_ = fStack_47c - fVar335 * fVar335;
              fVar278 = -fVar277 * fVar305;
              auVar218._8_4_ = auVar189._8_4_;
              auVar218._0_8_ = auVar189._0_8_;
              auVar218._12_4_ = auVar189._12_4_;
              auVar309 = rsqrtss(auVar218,auVar189);
              fVar270 = auVar309._0_4_;
              fVar270 = fVar270 * 1.5 - fVar270 * fVar270 * fVar253 * 0.5 * fVar270;
              if (fVar253 < 0.0) {
                fVar253 = sqrtf(fVar253);
                uVar109 = extraout_RAX_00;
                pRVar115 = extraout_RDX_00;
              }
              else {
                fVar253 = SQRT(fVar253);
              }
              fVar253 = fVar253 - fVar337;
              fVar321 = ((-fVar336 * fVar304 + -fVar334 * fVar275 + -fVar324 * fVar302) -
                        fVar428 * fVar307) * fVar270 - fVar277;
              fVar270 = ((fVar303 * fVar304 + fVar271 * fVar275 + fVar269 * fVar302) -
                        fVar428 * fVar273) * fVar270;
              auVar331._4_4_ = fVar427;
              auVar331._0_4_ = fVar307;
              auVar264._0_4_ = fVar307 * fVar270 - fVar273 * fVar321;
              auVar298._8_4_ = -fVar278;
              auVar298._0_8_ = CONCAT44(fVar278,fVar321) ^ 0x8000000000000000;
              auVar298._12_4_ = fVar305 * 0.0;
              auVar297._8_8_ = auVar298._8_8_;
              auVar297._0_8_ = CONCAT44(fVar270,fVar321) ^ 0x80000000;
              auVar264._4_4_ = auVar264._0_4_;
              auVar264._8_4_ = auVar264._0_4_;
              auVar264._12_4_ = auVar264._0_4_;
              auVar309 = divps(auVar297,auVar264);
              auVar331._8_4_ = fVar427;
              auVar331._12_4_ = -(fVar426 * 0.0);
              auVar330._8_8_ = auVar331._8_8_;
              auVar330._0_8_ = CONCAT44(fVar273,fVar307) ^ 0x8000000000000000;
              auVar231 = divps(auVar330,auVar264);
              fVar229 = fVar229 - (fVar253 * auVar231._0_4_ + fVar428 * auVar309._0_4_);
              fVar225 = fVar225 - (fVar253 * auVar231._4_4_ + fVar428 * auVar309._4_4_);
            } while ((fVar323 <= ABS(fVar428)) ||
                    (auVar365._12_4_ * 1.9073486e-06 + fVar251 + fVar323 <= ABS(fVar253)));
            fVar229 = fVar378 + fVar229;
            if ((fVar301 <= fVar229) &&
               (((fVar250 = *(float *)(ray + k * 4 + 0x80), fVar229 <= fVar250 && (0.0 <= fVar225))
                && (fVar225 <= 1.0)))) {
              auVar309 = rsqrtss(_local_488,_local_488);
              fVar251 = auVar309._0_4_;
              pGVar29 = (context->scene->geometries).items[(long)pRVar116].ptr;
              uVar109 = (ulong)*(uint *)(ray + k * 4 + 0x90);
              pRVar112 = pRVar116;
              if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar251 = fVar251 * 1.5 +
                          fVar251 * fVar251 * (float)local_488._0_4_ * -0.5 * fVar251;
                fVar302 = fVar302 * fVar251;
                fVar275 = fVar275 * fVar251;
                fVar304 = fVar304 * fVar251;
                fVar251 = fVar277 * fVar302 + fVar324;
                fVar253 = fVar277 * fVar275 + fVar334;
                fVar270 = fVar277 * fVar304 + fVar336;
                fVar273 = fVar275 * fVar324 - fVar334 * fVar302;
                fVar275 = fVar304 * fVar334 - fVar336 * fVar275;
                fVar302 = fVar302 * fVar336 - fVar324 * fVar304;
                fVar278 = fVar253 * fVar275 - fVar302 * fVar251;
                fVar253 = fVar270 * fVar302 - fVar273 * fVar253;
                fVar251 = fVar251 * fVar273 - fVar275 * fVar270;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  *(float *)(ray + k * 4 + 0xc0) = fVar253;
                  *(float *)(ray + k * 4 + 0xd0) = fVar251;
                  *(float *)(ray + k * 4 + 0xe0) = fVar278;
                  *(float *)(ray + k * 4 + 0xf0) = fVar225;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = uVar124;
                  *(uint *)(ray + k * 4 + 0x120) = uVar122;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar121 = context->user->instPrimID[0];
                  uVar109 = (ulong)uVar121;
                  *(uint *)(ray + k * 4 + 0x140) = uVar121;
                  pRVar112 = (RTCIntersectArguments *)context;
                }
                else {
                  local_388._4_4_ = fVar253;
                  local_388._0_4_ = fVar253;
                  fStack_380 = fVar253;
                  fStack_37c = fVar253;
                  local_378 = fVar251;
                  fStack_374 = fVar251;
                  fStack_370 = fVar251;
                  fStack_36c = fVar251;
                  local_368 = fVar278;
                  fStack_364 = fVar278;
                  fStack_360 = fVar278;
                  fStack_35c = fVar278;
                  local_358 = fVar225;
                  fStack_354 = fVar225;
                  fStack_350 = fVar225;
                  fStack_34c = fVar225;
                  local_348 = 0;
                  uStack_344 = 0;
                  uStack_340 = 0;
                  uStack_33c = 0;
                  local_338 = CONCAT44(uVar124,uVar124);
                  uStack_330 = CONCAT44(uVar124,uVar124);
                  local_328 = CONCAT44(uVar122,uVar122);
                  uStack_320 = CONCAT44(uVar122,uVar122);
                  local_318.flags = context->user->instID[0];
                  local_318.feature_mask = local_318.flags;
                  local_318.context._0_4_ = local_318.flags;
                  local_318.context._4_4_ = local_318.flags;
                  local_318.filter._0_4_ = context->user->instPrimID[0];
                  local_318.filter._4_4_ = (uint)local_318.filter;
                  local_318.intersect._0_4_ = (uint)local_318.filter;
                  local_318.intersect._4_4_ = (uint)local_318.filter;
                  *(float *)(ray + k * 4 + 0x80) = fVar229;
                  local_5c8 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_5c8;
                  args.geometryUserPtr = pGVar29->userPtr;
                  args.context = context->user;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)local_388;
                  args.N = 4;
                  p_Var33 = pGVar29->intersectionFilterN;
                  auVar485._8_8_ = &local_318;
                  auVar485._0_8_ = p_Var33;
                  pRVar112 = (RTCIntersectArguments *)context;
                  if (p_Var33 != (RTCFilterFunctionN)0x0) {
                    auVar485 = (*p_Var33)(&args);
                  }
                  pRVar115 = auVar485._8_8_;
                  auVar219._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                  auVar219._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                  auVar219._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                  auVar219._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                  uVar121 = movmskps(auVar485._0_4_,auVar219);
                  pRVar111 = (RTCRayN *)(ulong)(uVar121 ^ 0xf);
                  if ((uVar121 ^ 0xf) == 0) {
                    auVar219 = auVar219 ^ _DAT_01f46b70;
                  }
                  else {
                    pRVar112 = context->args;
                    pRVar113 = (RTCIntersectArguments *)pRVar112->filter;
                    auVar102._8_8_ = pRVar115;
                    auVar102._0_8_ = pRVar113;
                    auVar486._8_8_ = pRVar115;
                    auVar486._0_8_ = pRVar113;
                    if ((pRVar113 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar112->flags & 2) != 0 ||
                        (auVar486 = auVar102, ((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar486 = (*(code *)pRVar113)(&args);
                    }
                    pRVar115 = auVar486._8_8_;
                    auVar190._0_4_ = -(uint)(local_5c8._0_4_ == 0);
                    auVar190._4_4_ = -(uint)(local_5c8._4_4_ == 0);
                    auVar190._8_4_ = -(uint)(local_5c8._8_4_ == 0);
                    auVar190._12_4_ = -(uint)(local_5c8._12_4_ == 0);
                    auVar219 = auVar190 ^ _DAT_01f46b70;
                    uVar121 = movmskps(auVar486._0_4_,auVar190);
                    pRVar111 = (RTCRayN *)(ulong)(uVar121 ^ 0xf);
                    if ((uVar121 ^ 0xf) != 0) {
                      auVar243._0_4_ = *(uint *)(args.ray + 0xc0) & auVar190._0_4_;
                      auVar243._4_4_ = *(uint *)(args.ray + 0xc4) & auVar190._4_4_;
                      auVar243._8_4_ = *(uint *)(args.ray + 200) & auVar190._8_4_;
                      auVar243._12_4_ = *(uint *)(args.ray + 0xcc) & auVar190._12_4_;
                      auVar332._0_4_ = ~auVar190._0_4_ & *(uint *)args.hit;
                      auVar332._4_4_ = ~auVar190._4_4_ & *(uint *)(args.hit + 4);
                      auVar332._8_4_ = ~auVar190._8_4_ & *(uint *)(args.hit + 8);
                      auVar332._12_4_ = ~auVar190._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar332 | auVar243;
                      uVar121 = *(uint *)(args.hit + 0x14);
                      uVar123 = *(uint *)(args.hit + 0x18);
                      uVar125 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar190._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar190._4_4_ & uVar121 | *(uint *)(args.ray + 0xd4) & auVar190._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar190._8_4_ & uVar123 | *(uint *)(args.ray + 0xd8) & auVar190._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar190._12_4_ & uVar125 | *(uint *)(args.ray + 0xdc) & auVar190._12_4_
                      ;
                      uVar121 = *(uint *)(args.hit + 0x24);
                      uVar123 = *(uint *)(args.hit + 0x28);
                      uVar125 = *(uint *)(args.hit + 0x2c);
                      *(uint *)(args.ray + 0xe0) =
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x20) |
                           *(uint *)(args.ray + 0xe0) & auVar190._0_4_;
                      *(uint *)(args.ray + 0xe4) =
                           ~auVar190._4_4_ & uVar121 | *(uint *)(args.ray + 0xe4) & auVar190._4_4_;
                      *(uint *)(args.ray + 0xe8) =
                           ~auVar190._8_4_ & uVar123 | *(uint *)(args.ray + 0xe8) & auVar190._8_4_;
                      *(uint *)(args.ray + 0xec) =
                           ~auVar190._12_4_ & uVar125 | *(uint *)(args.ray + 0xec) & auVar190._12_4_
                      ;
                      auVar316._0_4_ = *(uint *)(args.ray + 0xf0) & auVar190._0_4_;
                      auVar316._4_4_ = *(uint *)(args.ray + 0xf4) & auVar190._4_4_;
                      auVar316._8_4_ = *(uint *)(args.ray + 0xf8) & auVar190._8_4_;
                      auVar316._12_4_ = *(uint *)(args.ray + 0xfc) & auVar190._12_4_;
                      auVar244._0_4_ = ~auVar190._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar244._4_4_ = ~auVar190._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar244._8_4_ = ~auVar190._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar244._12_4_ = ~auVar190._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar244 | auVar316;
                      uVar121 = *(uint *)(args.hit + 0x44);
                      uVar123 = *(uint *)(args.hit + 0x48);
                      uVar125 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar190._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar190._4_4_ & uVar121 | *(uint *)(args.ray + 0x104) & auVar190._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar190._8_4_ & uVar123 | *(uint *)(args.ray + 0x108) & auVar190._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar190._12_4_ & uVar125 |
                           *(uint *)(args.ray + 0x10c) & auVar190._12_4_;
                      uVar121 = *(uint *)(args.hit + 0x54);
                      uVar123 = *(uint *)(args.hit + 0x58);
                      uVar125 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar190._0_4_ |
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar190._4_4_ | ~auVar190._4_4_ & uVar121;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar190._8_4_ | ~auVar190._8_4_ & uVar123;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar190._12_4_ |
                           ~auVar190._12_4_ & uVar125;
                      uVar121 = *(uint *)(args.hit + 100);
                      uVar123 = *(uint *)(args.hit + 0x68);
                      uVar125 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar190._0_4_ |
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar190._4_4_ | ~auVar190._4_4_ & uVar121;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar190._8_4_ | ~auVar190._8_4_ & uVar123;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar190._12_4_ | ~auVar190._12_4_ & uVar125;
                      uVar121 = *(uint *)(args.hit + 0x74);
                      uVar123 = *(uint *)(args.hit + 0x78);
                      uVar125 = *(uint *)(args.hit + 0x7c);
                      *(uint *)(args.ray + 0x130) =
                           ~auVar190._0_4_ & *(uint *)(args.hit + 0x70) |
                           *(uint *)(args.ray + 0x130) & auVar190._0_4_;
                      *(uint *)(args.ray + 0x134) =
                           ~auVar190._4_4_ & uVar121 | *(uint *)(args.ray + 0x134) & auVar190._4_4_;
                      *(uint *)(args.ray + 0x138) =
                           ~auVar190._8_4_ & uVar123 | *(uint *)(args.ray + 0x138) & auVar190._8_4_;
                      *(uint *)(args.ray + 0x13c) =
                           ~auVar190._12_4_ & uVar125 |
                           *(uint *)(args.ray + 0x13c) & auVar190._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar190 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar190;
                      pRVar111 = args.ray;
                      pRVar112 = (RTCIntersectArguments *)args.hit;
                    }
                  }
                  auVar220._0_4_ = auVar219._0_4_ << 0x1f;
                  auVar220._4_4_ = auVar219._4_4_ << 0x1f;
                  auVar220._8_4_ = auVar219._8_4_ << 0x1f;
                  auVar220._12_4_ = auVar219._12_4_ << 0x1f;
                  iVar129 = movmskps((int)pRVar111,auVar220);
                  uVar109 = CONCAT44((int)((ulong)pRVar111 >> 0x20),iVar129);
                  if (iVar129 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar250;
                  }
                }
              }
            }
LAB_0035cfd6:
            fVar431 = *(float *)(ray + k * 4 + 0x80);
            auVar187._0_4_ = -(uint)(fVar462 <= fVar431) & local_3a8._0_4_;
            auVar187._4_4_ = -(uint)(fVar464 <= fVar431) & local_3a8._4_4_;
            auVar187._8_4_ = -(uint)(fVar474 <= fVar431) & local_3a8._8_4_;
            auVar187._12_4_ = -(uint)(fVar475 <= fVar431) & local_3a8._12_4_;
            auVar294 = auVar349;
          }
          auVar317._0_4_ = auVar209._0_4_ & auVar294._0_4_ & -(uint)(fVar378 + fVar466 <= fVar431);
          auVar317._4_4_ = auVar209._4_4_ & auVar294._4_4_ & -(uint)(fVar378 + fVar476 <= fVar431);
          auVar317._8_4_ = auVar209._8_4_ & auVar294._8_4_ & -(uint)(fVar378 + fVar248 <= fVar431);
          auVar317._12_4_ =
               auVar209._12_4_ & auVar294._12_4_ & -(uint)(fVar378 + fVar459 <= fVar431);
          auVar299._0_4_ =
               auVar186._0_4_ & auVar240._0_4_ &
               -(uint)(fVar378 + tp1.lower.field_0.v[0] <= fVar431);
          auVar299._4_4_ =
               auVar186._4_4_ & auVar240._4_4_ &
               -(uint)(fVar378 + tp1.lower.field_0.v[1] <= fVar431);
          auVar299._8_4_ =
               auVar186._8_4_ & auVar240._8_4_ &
               -(uint)(fVar378 + tp1.lower.field_0.v[2] <= fVar431);
          auVar299._12_4_ =
               auVar186._12_4_ & auVar240._12_4_ &
               -(uint)(fVar378 + tp1.lower.field_0.v[3] <= fVar431);
          iVar129 = movmskps(0,auVar299 | auVar317);
          pRVar113 = pRVar112;
          if (iVar129 != 0) {
            stack[(long)pRVar117].valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar299 | auVar317);
            auVar191._0_4_ = (uint)fVar466 & auVar317._0_4_;
            auVar191._4_4_ = (uint)fVar476 & auVar317._4_4_;
            auVar191._8_4_ = (uint)fVar248 & auVar317._8_4_;
            auVar191._12_4_ = (uint)fVar459 & auVar317._12_4_;
            auVar318._0_4_ = ~auVar317._0_4_ & tp1.lower.field_0.i[0];
            auVar318._4_4_ = ~auVar317._4_4_ & tp1.lower.field_0.i[1];
            auVar318._8_4_ = ~auVar317._8_4_ & tp1.lower.field_0.i[2];
            auVar318._12_4_ = ~auVar317._12_4_ & tp1.lower.field_0.i[3];
            stack[(long)pRVar117].tlower.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar318 | auVar191);
            stack[(long)pRVar117].u0 = fVar306;
            stack[(long)pRVar117].u1 = fVar320;
            stack[(long)pRVar117].depth = uVar126 + 1;
            pRVar117 = (RTCIntersectArguments *)(ulong)((int)pRVar117 + 1);
          }
        }
      }
    }
    do {
      pRVar118 = pRVar117;
      iVar129 = (int)pRVar118;
      if (iVar129 == 0) {
        fVar269 = *(float *)(ray + k * 4 + 0x80);
        auVar224._4_4_ = -(uint)(fVar247 <= fVar269);
        auVar224._0_4_ = -(uint)(fVar228 <= fVar269);
        auVar224._8_4_ = -(uint)(fVar249 <= fVar269);
        auVar224._12_4_ = -(uint)(fVar252 <= fVar269);
        uVar122 = movmskps((int)pRVar113,auVar224);
        uVar120 = uVar120 - 1 & uVar120 & uVar122;
        goto LAB_0035aa86;
      }
      pRVar113 = (RTCIntersectArguments *)(ulong)(iVar129 - 1U);
      fVar320 = stack[(long)pRVar113].tlower.field_0.v[0];
      fVar459 = stack[(long)pRVar113].tlower.field_0.v[1];
      fVar462 = stack[(long)pRVar113].tlower.field_0.v[2];
      fVar464 = stack[(long)pRVar113].tlower.field_0.v[3];
      fVar306 = *(float *)(ray + k * 4 + 0x80);
      aVar192._0_4_ =
           -(uint)(fVar378 + fVar320 <= fVar306) & stack[(long)pRVar113].valid.field_0.i[0];
      aVar192._4_4_ =
           -(uint)(fVar378 + fVar459 <= fVar306) & stack[(long)pRVar113].valid.field_0.i[1];
      aVar192.i[2] = -(uint)(fVar378 + fVar462 <= fVar306) &
                     stack[(long)pRVar113].valid.field_0.i[2];
      aVar192.i[3] = -(uint)(fVar378 + fVar464 <= fVar306) &
                     stack[(long)pRVar113].valid.field_0.i[3];
      _local_388 = aVar192;
      uVar121 = movmskps((int)pRVar115,(undefined1  [16])aVar192);
      pRVar115 = (RTCIntersectArguments *)(ulong)uVar121;
      pRVar117 = pRVar113;
    } while (uVar121 == 0);
    auVar221._0_4_ = (uint)fVar320 & aVar192._0_4_;
    auVar221._4_4_ = (uint)fVar459 & aVar192._4_4_;
    auVar221._8_4_ = (uint)fVar462 & aVar192.i[2];
    auVar221._12_4_ = (uint)fVar464 & aVar192.i[3];
    auVar245._0_8_ = CONCAT44(~aVar192._4_4_,~aVar192._0_4_) & 0x7f8000007f800000;
    auVar245._8_4_ = ~aVar192.i[2] & 0x7f800000;
    auVar245._12_4_ = ~aVar192.i[3] & 0x7f800000;
    auVar245 = auVar245 | auVar221;
    auVar265._4_4_ = auVar245._0_4_;
    auVar265._0_4_ = auVar245._4_4_;
    auVar265._8_4_ = auVar245._12_4_;
    auVar265._12_4_ = auVar245._8_4_;
    auVar309 = minps(auVar265,auVar245);
    auVar222._0_8_ = auVar309._8_8_;
    auVar222._8_4_ = auVar309._0_4_;
    auVar222._12_4_ = auVar309._4_4_;
    auVar309 = minps(auVar222,auVar309);
    auVar223._0_8_ =
         CONCAT44(-(uint)(auVar309._4_4_ == auVar245._4_4_) & aVar192._4_4_,
                  -(uint)(auVar309._0_4_ == auVar245._0_4_) & aVar192._0_4_);
    auVar223._8_4_ = -(uint)(auVar309._8_4_ == auVar245._8_4_) & aVar192.i[2];
    auVar223._12_4_ = -(uint)(auVar309._12_4_ == auVar245._12_4_) & aVar192.i[3];
    iVar194 = movmskps(iVar129 - 1U,auVar223);
    if (iVar194 != 0) {
      aVar192.i[2] = auVar223._8_4_;
      aVar192._0_8_ = auVar223._0_8_;
      aVar192.i[3] = auVar223._12_4_;
    }
    pSVar108 = stack + (long)pRVar113;
    uVar126 = movmskps(iVar194,(undefined1  [16])aVar192);
    pRVar112 = (RTCIntersectArguments *)0x0;
    if (uVar126 != 0) {
      for (; (uVar126 >> (long)pRVar112 & 1) == 0;
          pRVar112 = (RTCIntersectArguments *)((long)&pRVar112->flags + 1)) {
      }
    }
    *(undefined4 *)(local_388 + (long)pRVar112 * 4) = 0;
    uVar9 = stack[(long)pRVar113].u0;
    uVar20 = stack[(long)pRVar113].u1;
    uVar126 = stack[(long)pRVar113].depth;
    iVar194 = movmskps(uVar121,(undefined1  [16])_local_388);
    pRVar115 = (RTCIntersectArguments *)(ulong)(iVar129 - 1);
    if (iVar194 != 0) {
      pRVar115 = pRVar118;
    }
    (pSVar108->valid).field_0 = _local_388;
    fVar306 = (float)uVar20 - (float)uVar9;
    args.valid = (int *)CONCAT44(fVar306 * 0.33333334 + (float)uVar9,fVar306 * 0.0 + (float)uVar9);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar306 * 1.0 + (float)uVar9,fVar306 * 0.6666667 + (float)uVar9);
    fVar306 = *(float *)(local_588 + (long)pRVar112 * 4 + -0x30);
    fVar320 = *(float *)(local_588 + (long)pRVar112 * 4 + -0x2c);
    pRVar117 = pRVar115;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }